

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  uint uVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  RTCRayQueryContext *pRVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  long lVar63;
  byte bVar64;
  uint uVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar138;
  uint uVar139;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar157;
  undefined4 uVar158;
  float fVar172;
  float fVar173;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar168 [32];
  undefined1 auVar161 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar179;
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  vint4 ai;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  vint4 ai_1;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  vint4 ai_2;
  undefined1 auVar246 [16];
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  float fVar260;
  float fVar261;
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_af4;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  undefined1 (*local_860) [32];
  Primitive *local_858;
  ulong local_850;
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar60 = (ulong)(byte)prim[1];
  lVar61 = uVar60 * 0x25;
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x11 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  uVar158 = *(undefined4 *)(prim + lVar61 + 0x12);
  auVar262._4_4_ = uVar158;
  auVar262._0_4_ = uVar158;
  auVar262._8_4_ = uVar158;
  auVar262._12_4_ = uVar158;
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar69 = vsubps_avx512vl(auVar83,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar22 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar61 + 0x16)) *
           *(float *)(prim + lVar61 + 0x1a);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar24 = vpmovsxwd_avx(auVar83);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar91 = vpmovsxwd_avx(auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar92 = vpmovsxwd_avx(auVar88);
  auVar70 = vpbroadcastd_avx512vl();
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar71 = vpmovsxwd_avx512vl(auVar84);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar89 = vpmovsxwd_avx(auVar89);
  auVar83 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx512f(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar69 = vmulps_avx512vl(auVar262,auVar69);
  auVar72 = vmulps_avx512vl(auVar262,auVar83);
  auVar73 = vcvtdq2ps_avx512vl(auVar90);
  auVar74 = vcvtdq2ps_avx512vl(auVar79);
  auVar75 = vcvtdq2ps_avx512vl(auVar75);
  auVar76 = vcvtdq2ps_avx512vl(auVar76);
  auVar77 = vcvtdq2ps_avx512vl(auVar77);
  auVar83 = vcvtdq2ps_avx(auVar78);
  auVar87 = vcvtdq2ps_avx(auVar80);
  auVar88 = vcvtdq2ps_avx(auVar81);
  auVar84 = vcvtdq2ps_avx(auVar82);
  uVar158 = auVar72._0_4_;
  auVar253._4_4_ = uVar158;
  auVar253._0_4_ = uVar158;
  auVar253._8_4_ = uVar158;
  auVar253._12_4_ = uVar158;
  auVar90 = vshufps_avx(auVar72,auVar72,0x55);
  auVar79 = vshufps_avx(auVar72,auVar72,0xaa);
  auVar78 = vmulps_avx512vl(auVar79,auVar75);
  auVar159._0_4_ = auVar79._0_4_ * auVar83._0_4_;
  auVar159._4_4_ = auVar79._4_4_ * auVar83._4_4_;
  auVar159._8_4_ = auVar79._8_4_ * auVar83._8_4_;
  auVar159._12_4_ = auVar79._12_4_ * auVar83._12_4_;
  auVar72._0_4_ = auVar84._0_4_ * auVar79._0_4_;
  auVar72._4_4_ = auVar84._4_4_ * auVar79._4_4_;
  auVar72._8_4_ = auVar84._8_4_ * auVar79._8_4_;
  auVar72._12_4_ = auVar84._12_4_ * auVar79._12_4_;
  auVar79 = vfmadd231ps_avx512vl(auVar78,auVar90,auVar74);
  auVar78 = vfmadd231ps_avx512vl(auVar159,auVar90,auVar77);
  auVar90 = vfmadd231ps_fma(auVar72,auVar88,auVar90);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar253,auVar73);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar253,auVar76);
  auVar90 = vfmadd231ps_fma(auVar90,auVar87,auVar253);
  auVar80 = vbroadcastss_avx512vl(auVar69);
  auVar81 = vshufps_avx512vl(auVar69,auVar69,0x55);
  auVar82 = vshufps_avx512vl(auVar69,auVar69,0xaa);
  auVar75 = vmulps_avx512vl(auVar82,auVar75);
  auVar83 = vmulps_avx512vl(auVar82,auVar83);
  auVar84 = vmulps_avx512vl(auVar82,auVar84);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar74);
  auVar77 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar77);
  auVar83 = vfmadd231ps_fma(auVar84,auVar81,auVar88);
  auVar72 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar73);
  auVar73 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar76);
  auVar258._8_4_ = 0x7fffffff;
  auVar258._0_8_ = 0x7fffffff7fffffff;
  auVar258._12_4_ = 0x7fffffff;
  auVar69 = vfmadd231ps_fma(auVar83,auVar80,auVar87);
  auVar83 = vandps_avx(auVar258,auVar79);
  auVar256._8_4_ = 0x219392ef;
  auVar256._0_8_ = 0x219392ef219392ef;
  auVar256._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar83,auVar256,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar74._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar79._12_4_;
  auVar83 = vandps_avx(auVar258,auVar78);
  uVar67 = vcmpps_avx512vl(auVar83,auVar256,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar85._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._12_4_;
  auVar83 = vandps_avx(auVar258,auVar90);
  uVar67 = vcmpps_avx512vl(auVar83,auVar256,1);
  bVar66 = (bool)((byte)uVar67 & 1);
  auVar86._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar90._0_4_;
  bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar90._4_4_;
  bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar90._8_4_;
  bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar90._12_4_;
  auVar87 = vrcp14ps_avx512vl(auVar74);
  auVar257._8_4_ = 0x3f800000;
  auVar257._0_8_ = 0x3f8000003f800000;
  auVar257._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar74,auVar87,auVar257);
  auVar88 = vfmadd132ps_fma(auVar83,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar83 = vfnmadd213ps_fma(auVar85,auVar87,auVar257);
  auVar84 = vfmadd132ps_fma(auVar83,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar86);
  auVar83 = vfnmadd213ps_fma(auVar86,auVar87,auVar257);
  auVar81 = vfmadd132ps_fma(auVar83,auVar87,auVar87);
  auVar229._4_4_ = fVar22;
  auVar229._0_4_ = fVar22;
  auVar229._8_4_ = fVar22;
  auVar229._12_4_ = fVar22;
  auVar83 = vcvtdq2ps_avx(auVar24);
  auVar87 = vcvtdq2ps_avx(auVar91);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar82 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar92);
  auVar87 = vcvtdq2ps_avx512vl(auVar71);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar24 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar60 * 0x16 + 6);
  auVar87 = vpmovsxwd_avx(auVar90);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar89 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar83 = vpmovsxwd_avx(auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar87 = vpmovsxwd_avx(auVar75);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar90 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar76);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 * 0x21 + 6);
  auVar87 = vpmovsxwd_avx(auVar77);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar79 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 * 0x1f + 6);
  auVar83 = vpmovsxwd_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar87 = vpmovsxwd_avx(auVar80);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar83);
  auVar87 = vfmadd213ps_fma(auVar87,auVar229,auVar83);
  auVar83 = vsubps_avx512vl(auVar82,auVar72);
  auVar230._0_4_ = auVar88._0_4_ * auVar83._0_4_;
  auVar230._4_4_ = auVar88._4_4_ * auVar83._4_4_;
  auVar230._8_4_ = auVar88._8_4_ * auVar83._8_4_;
  auVar230._12_4_ = auVar88._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx512vl(auVar24,auVar72);
  auVar180._0_4_ = auVar88._0_4_ * auVar83._0_4_;
  auVar180._4_4_ = auVar88._4_4_ * auVar83._4_4_;
  auVar180._8_4_ = auVar88._8_4_ * auVar83._8_4_;
  auVar180._12_4_ = auVar88._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar89,auVar73);
  auVar240._0_4_ = auVar84._0_4_ * auVar83._0_4_;
  auVar240._4_4_ = auVar84._4_4_ * auVar83._4_4_;
  auVar240._8_4_ = auVar84._8_4_ * auVar83._8_4_;
  auVar240._12_4_ = auVar84._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar90,auVar73);
  auVar71._0_4_ = auVar84._0_4_ * auVar83._0_4_;
  auVar71._4_4_ = auVar84._4_4_ * auVar83._4_4_;
  auVar71._8_4_ = auVar84._8_4_ * auVar83._8_4_;
  auVar71._12_4_ = auVar84._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar79,auVar69);
  auVar73._0_4_ = auVar81._0_4_ * auVar83._0_4_;
  auVar73._4_4_ = auVar81._4_4_ * auVar83._4_4_;
  auVar73._8_4_ = auVar81._8_4_ * auVar83._8_4_;
  auVar73._12_4_ = auVar81._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar87,auVar69);
  auVar92._0_4_ = auVar81._0_4_ * auVar83._0_4_;
  auVar92._4_4_ = auVar81._4_4_ * auVar83._4_4_;
  auVar92._8_4_ = auVar81._8_4_ * auVar83._8_4_;
  auVar92._12_4_ = auVar81._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar230,auVar180);
  auVar87 = vpminsd_avx(auVar240,auVar71);
  auVar83 = vmaxps_avx(auVar83,auVar87);
  auVar87 = vpminsd_avx(auVar73,auVar92);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar81._4_4_ = uVar158;
  auVar81._0_4_ = uVar158;
  auVar81._8_4_ = uVar158;
  auVar81._12_4_ = uVar158;
  auVar87 = vmaxps_avx512vl(auVar87,auVar81);
  auVar83 = vmaxps_avx(auVar83,auVar87);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  local_4a0 = vmulps_avx512vl(auVar83,auVar82);
  auVar83 = vpmaxsd_avx(auVar230,auVar180);
  auVar87 = vpmaxsd_avx(auVar240,auVar71);
  auVar83 = vminps_avx(auVar83,auVar87);
  auVar87 = vpmaxsd_avx(auVar73,auVar92);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar24._4_4_ = uVar158;
  auVar24._0_4_ = uVar158;
  auVar24._8_4_ = uVar158;
  auVar24._12_4_ = uVar158;
  auVar87 = vminps_avx512vl(auVar87,auVar24);
  auVar83 = vminps_avx(auVar83,auVar87);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar91);
  uVar25 = vcmpps_avx512vl(local_4a0,auVar83,2);
  uVar27 = vpcmpgtd_avx512vl(auVar70,_DAT_01f4ad30);
  local_850 = (ulong)((byte)uVar25 & 0xf & (byte)uVar27);
  local_860 = (undefined1 (*) [32])&local_300;
  local_480 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_858 = prim;
LAB_0190d665:
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  if (local_850 == 0) {
    return;
  }
  lVar61 = 0;
  for (uVar67 = local_850; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  local_848 = (ulong)*(uint *)(prim + lVar61 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_848 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar22 = (pGVar8->time_range).lower;
  fVar22 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar22) / ((pGVar8->time_range).upper - fVar22));
  auVar83 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),9);
  auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
  fVar22 = fVar22 - auVar83._0_4_;
  fVar157 = 1.0 - fVar22;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)auVar83._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar63);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar63);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar63);
  pfVar5 = (float *)(lVar11 + lVar12 * uVar67);
  auVar70._0_4_ = fVar22 * *pfVar5;
  auVar70._4_4_ = fVar22 * pfVar5[1];
  auVar70._8_4_ = fVar22 * pfVar5[2];
  auVar70._12_4_ = fVar22 * pfVar5[3];
  lVar61 = uVar67 + 1;
  pfVar5 = (float *)(lVar11 + lVar12 * lVar61);
  auVar160._0_4_ = fVar22 * *pfVar5;
  auVar160._4_4_ = fVar22 * pfVar5[1];
  auVar160._8_4_ = fVar22 * pfVar5[2];
  auVar160._12_4_ = fVar22 * pfVar5[3];
  p_Var13 = pGVar8[4].occlusionFilterN;
  auVar181._4_4_ = fVar157;
  auVar181._0_4_ = fVar157;
  auVar181._8_4_ = fVar157;
  auVar181._12_4_ = fVar157;
  auVar84 = vfmadd231ps_fma(auVar70,auVar181,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar63) + lVar10 * uVar67));
  auVar89 = vfmadd231ps_fma(auVar160,auVar181,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar63) + lVar10 * lVar61));
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar63 + 0x38) +
                    uVar67 * *(long *)(p_Var13 + lVar63 + 0x48));
  auVar220._0_4_ = fVar22 * *pfVar5;
  auVar220._4_4_ = fVar22 * pfVar5[1];
  auVar220._8_4_ = fVar22 * pfVar5[2];
  auVar220._12_4_ = fVar22 * pfVar5[3];
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar63 + 0x38) +
                    *(long *)(p_Var13 + lVar63 + 0x48) * lVar61);
  auVar201._0_4_ = fVar22 * *pfVar5;
  auVar201._4_4_ = fVar22 * pfVar5[1];
  auVar201._8_4_ = fVar22 * pfVar5[2];
  auVar201._12_4_ = fVar22 * pfVar5[3];
  auVar88 = vfmadd231ps_fma(auVar220,auVar181,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar63) +
                             *(long *)(p_Var13 + lVar63 + 0x10) * uVar67));
  auVar90 = vfmadd231ps_fma(auVar201,auVar181,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar63) +
                             *(long *)(p_Var13 + lVar63 + 0x10) * lVar61));
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar87 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar265 = ZEXT3264(local_780);
  local_400 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar83 = vunpcklps_avx512vl(local_780._0_16_,local_400._0_16_);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar266 = ZEXT3264(local_7a0);
  auVar76 = local_7a0._0_16_;
  local_7b0 = vinsertps_avx512f(auVar83,auVar76,0x28);
  auVar231._8_4_ = 0xbeaaaaab;
  auVar231._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar231._12_4_ = 0xbeaaaaab;
  auVar79 = vfnmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar88 = vfmadd213ps_fma(auVar90,auVar231,auVar89);
  auVar232._0_4_ = auVar89._0_4_ + auVar84._0_4_ + auVar79._0_4_ + auVar88._0_4_;
  auVar232._4_4_ = auVar89._4_4_ + auVar84._4_4_ + auVar79._4_4_ + auVar88._4_4_;
  auVar232._8_4_ = auVar89._8_4_ + auVar84._8_4_ + auVar79._8_4_ + auVar88._8_4_;
  auVar232._12_4_ = auVar89._12_4_ + auVar84._12_4_ + auVar79._12_4_ + auVar88._12_4_;
  auVar69._8_4_ = 0x3e800000;
  auVar69._0_8_ = 0x3e8000003e800000;
  auVar69._12_4_ = 0x3e800000;
  auVar83 = vmulps_avx512vl(auVar232,auVar69);
  auVar83 = vsubps_avx(auVar83,auVar87);
  auVar83 = vdpps_avx(auVar83,local_7b0,0x7f);
  local_7c0 = vdpps_avx(local_7b0,local_7b0,0x7f);
  fVar22 = *(float *)(ray + k * 4 + 0x60);
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = local_7c0._0_4_;
  auVar75 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar241);
  auVar90 = vfnmadd213ss_fma(auVar75,local_7c0,ZEXT416(0x40000000));
  local_260 = auVar83._0_4_ * auVar75._0_4_ * auVar90._0_4_;
  auVar239 = ZEXT3264(_DAT_01f7b040);
  auVar246._4_4_ = local_260;
  auVar246._0_4_ = local_260;
  auVar246._8_4_ = local_260;
  auVar246._12_4_ = local_260;
  fStack_4f0 = local_260;
  _local_500 = auVar246;
  fStack_4ec = local_260;
  fStack_4e8 = local_260;
  fStack_4e4 = local_260;
  auVar83 = vfmadd231ps_fma(auVar87,local_7b0,auVar246);
  auVar83 = vblendps_avx(auVar83,ZEXT816(0) << 0x40,8);
  auVar87 = vsubps_avx(auVar84,auVar83);
  auVar88 = vsubps_avx(auVar88,auVar83);
  auVar84 = vsubps_avx(auVar79,auVar83);
  auVar83 = vsubps_avx(auVar89,auVar83);
  uVar158 = auVar87._0_4_;
  local_840._4_4_ = uVar158;
  local_840._0_4_ = uVar158;
  local_840._8_4_ = uVar158;
  local_840._12_4_ = uVar158;
  local_840._16_4_ = uVar158;
  local_840._20_4_ = uVar158;
  local_840._24_4_ = uVar158;
  local_840._28_4_ = uVar158;
  auVar255 = ZEXT3264(local_840);
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  local_620 = ZEXT1632(auVar87);
  local_7e0 = vpermps_avx2(auVar100,local_620);
  auVar101._8_4_ = 2;
  auVar101._0_8_ = 0x200000002;
  auVar101._12_4_ = 2;
  auVar101._16_4_ = 2;
  auVar101._20_4_ = 2;
  auVar101._24_4_ = 2;
  auVar101._28_4_ = 2;
  local_800 = vpermps_avx2(auVar101,local_620);
  auVar102._8_4_ = 3;
  auVar102._0_8_ = 0x300000003;
  auVar102._12_4_ = 3;
  auVar102._16_4_ = 3;
  auVar102._20_4_ = 3;
  auVar102._24_4_ = 3;
  auVar102._28_4_ = 3;
  auVar93 = vpermps_avx512vl(auVar102,local_620);
  auVar267 = ZEXT3264(auVar93);
  auVar250 = ZEXT3264(local_7e0);
  uVar158 = auVar84._0_4_;
  local_760._4_4_ = uVar158;
  local_760._0_4_ = uVar158;
  local_760._8_4_ = uVar158;
  local_760._12_4_ = uVar158;
  local_760._16_4_ = uVar158;
  local_760._20_4_ = uVar158;
  local_760._24_4_ = uVar158;
  local_760._28_4_ = uVar158;
  local_660 = ZEXT1632(auVar84);
  local_820 = vpermps_avx2(auVar100,local_660);
  auVar263 = ZEXT3264(local_820);
  auVar93 = vpermps_avx512vl(auVar101,local_660);
  auVar264 = ZEXT3264(auVar93);
  auVar94 = vpermps_avx512vl(auVar102,local_660);
  auVar228 = ZEXT3264(local_760);
  auVar95 = vbroadcastss_avx512vl(auVar88);
  local_640 = ZEXT1632(auVar88);
  auVar96 = vpermps_avx512vl(auVar100,local_640);
  auVar97 = vpermps_avx512vl(auVar101,local_640);
  auVar98 = vpermps_avx512vl(auVar102,local_640);
  auVar99 = vbroadcastss_avx512vl(auVar83);
  _local_680 = ZEXT1632(auVar83);
  auVar100 = vpermps_avx512vl(auVar100,_local_680);
  auVar101 = vpermps_avx512vl(auVar101,_local_680);
  auVar102 = vpermps_avx512vl(auVar102,_local_680);
  auVar83 = vmulss_avx512f(auVar76,auVar76);
  auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),local_400,local_400);
  auVar103 = vfmadd231ps_avx512vl(auVar103,local_780,local_780);
  local_220._0_4_ = auVar103._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar105,local_220);
  auVar252 = ZEXT3264(local_800);
  local_6e0 = ZEXT416((uint)local_260);
  local_260 = fVar22 - local_260;
  auVar245 = ZEXT3264(local_820);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_420 = vpbroadcastd_avx512vl();
  uVar65 = 0;
  local_af4 = 1;
  local_440 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_7c0,local_7c0);
  auVar87 = vsqrtss_avx(local_7c0,local_7c0);
  local_490 = ZEXT816(0x3f80000000000000);
  do {
    auVar88 = vmovshdup_avx(local_490);
    auVar88 = vsubps_avx(auVar88,local_490);
    fVar175 = auVar88._0_4_;
    fVar176 = fVar175 * 0.04761905;
    auVar196._0_4_ = local_490._0_4_;
    auVar196._4_4_ = auVar196._0_4_;
    auVar196._8_4_ = auVar196._0_4_;
    auVar196._12_4_ = auVar196._0_4_;
    auVar196._16_4_ = auVar196._0_4_;
    auVar196._20_4_ = auVar196._0_4_;
    auVar196._24_4_ = auVar196._0_4_;
    auVar196._28_4_ = auVar196._0_4_;
    auVar216._4_4_ = fVar175;
    auVar216._0_4_ = fVar175;
    auVar216._8_4_ = fVar175;
    auVar216._12_4_ = fVar175;
    auVar216._16_4_ = fVar175;
    auVar216._20_4_ = fVar175;
    auVar216._24_4_ = fVar175;
    auVar216._28_4_ = fVar175;
    auVar88 = vfmadd231ps_fma(auVar196,auVar216,auVar239._0_32_);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar105 = vsubps_avx512vl(auVar104,ZEXT1632(auVar88));
    fVar157 = auVar88._0_4_;
    fVar172 = auVar88._4_4_;
    auVar107._4_4_ = auVar228._4_4_ * fVar172;
    auVar107._0_4_ = auVar228._0_4_ * fVar157;
    fVar173 = auVar88._8_4_;
    auVar107._8_4_ = auVar228._8_4_ * fVar173;
    fVar174 = auVar88._12_4_;
    auVar107._12_4_ = auVar228._12_4_ * fVar174;
    auVar107._16_4_ = auVar228._16_4_ * 0.0;
    auVar107._20_4_ = auVar228._20_4_ * 0.0;
    auVar107._24_4_ = auVar228._24_4_ * 0.0;
    auVar107._28_4_ = auVar196._0_4_;
    auVar109 = ZEXT1632(auVar88);
    auVar108._4_4_ = auVar245._4_4_ * fVar172;
    auVar108._0_4_ = auVar245._0_4_ * fVar157;
    auVar108._8_4_ = auVar245._8_4_ * fVar173;
    auVar108._12_4_ = auVar245._12_4_ * fVar174;
    auVar108._16_4_ = auVar245._16_4_ * 0.0;
    auVar108._20_4_ = auVar245._20_4_ * 0.0;
    auVar108._24_4_ = auVar245._24_4_ * 0.0;
    auVar108._28_4_ = fVar175;
    auVar103 = vmulps_avx512vl(auVar264._0_32_,auVar109);
    auVar106 = vmulps_avx512vl(auVar94,auVar109);
    auVar84 = vfmadd231ps_fma(auVar107,auVar105,auVar255._0_32_);
    auVar89 = vfmadd231ps_fma(auVar108,auVar105,auVar250._0_32_);
    auVar90 = vfmadd231ps_fma(auVar103,auVar105,auVar252._0_32_);
    local_8a0 = auVar267._0_32_;
    auVar103 = vfmadd231ps_avx512vl(auVar106,auVar105,local_8a0);
    auVar107 = vmulps_avx512vl(auVar95,auVar109);
    auVar113 = ZEXT1632(auVar88);
    auVar108 = vmulps_avx512vl(auVar96,auVar113);
    auVar106 = vmulps_avx512vl(auVar97,auVar113);
    auVar109 = vmulps_avx512vl(auVar98,auVar113);
    auVar79 = vfmadd231ps_fma(auVar107,auVar105,auVar228._0_32_);
    auVar75 = vfmadd231ps_fma(auVar108,auVar105,auVar245._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar264._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar94);
    auVar106 = vmulps_avx512vl(auVar99,auVar113);
    auVar109 = vmulps_avx512vl(auVar100,auVar113);
    auVar110 = vmulps_avx512vl(auVar101,auVar113);
    auVar111 = vmulps_avx512vl(auVar102,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar95);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar96);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar97);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,auVar98);
    auVar228._28_36_ = auVar263._28_36_;
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(fVar174 * auVar79._12_4_,
                            CONCAT48(fVar173 * auVar79._8_4_,
                                     CONCAT44(fVar172 * auVar79._4_4_,fVar157 * auVar79._0_4_))));
    auVar106 = vmulps_avx512vl(auVar113,ZEXT1632(auVar75));
    auVar113 = vmulps_avx512vl(ZEXT1632(auVar88),auVar107);
    auVar114 = vmulps_avx512vl(ZEXT1632(auVar88),auVar108);
    auVar88 = vfmadd231ps_fma(auVar228._0_32_,auVar105,ZEXT1632(auVar84));
    auVar115 = vfmadd231ps_avx512vl(auVar106,auVar105,ZEXT1632(auVar89));
    auVar116 = vfmadd231ps_avx512vl(auVar113,auVar105,ZEXT1632(auVar90));
    auVar117 = vfmadd231ps_avx512vl(auVar114,auVar105,auVar103);
    auVar106._4_4_ = auVar112._4_4_ * fVar172;
    auVar106._0_4_ = auVar112._0_4_ * fVar157;
    auVar106._8_4_ = auVar112._8_4_ * fVar173;
    auVar106._12_4_ = auVar112._12_4_ * fVar174;
    auVar106._16_4_ = auVar112._16_4_ * 0.0;
    auVar106._20_4_ = auVar112._20_4_ * 0.0;
    auVar106._24_4_ = auVar112._24_4_ * 0.0;
    auVar106._28_4_ = auVar103._28_4_;
    auVar113._4_4_ = auVar109._4_4_ * fVar172;
    auVar113._0_4_ = auVar109._0_4_ * fVar157;
    auVar113._8_4_ = auVar109._8_4_ * fVar173;
    auVar113._12_4_ = auVar109._12_4_ * fVar174;
    auVar113._16_4_ = auVar109._16_4_ * 0.0;
    auVar113._20_4_ = auVar109._20_4_ * 0.0;
    auVar113._24_4_ = auVar109._24_4_ * 0.0;
    auVar113._28_4_ = auVar112._28_4_;
    auVar114._4_4_ = auVar110._4_4_ * fVar172;
    auVar114._0_4_ = auVar110._0_4_ * fVar157;
    auVar114._8_4_ = auVar110._8_4_ * fVar173;
    auVar114._12_4_ = auVar110._12_4_ * fVar174;
    auVar114._16_4_ = auVar110._16_4_ * 0.0;
    auVar114._20_4_ = auVar110._20_4_ * 0.0;
    auVar114._24_4_ = auVar110._24_4_ * 0.0;
    auVar114._28_4_ = auVar109._28_4_;
    auVar118._4_4_ = auVar111._4_4_ * fVar172;
    auVar118._0_4_ = auVar111._0_4_ * fVar157;
    auVar118._8_4_ = auVar111._8_4_ * fVar173;
    auVar118._12_4_ = auVar111._12_4_ * fVar174;
    auVar118._16_4_ = auVar111._16_4_ * 0.0;
    auVar118._20_4_ = auVar111._20_4_ * 0.0;
    auVar118._24_4_ = auVar111._24_4_ * 0.0;
    auVar118._28_4_ = auVar110._28_4_;
    auVar84 = vfmadd231ps_fma(auVar106,auVar105,ZEXT1632(auVar79));
    auVar89 = vfmadd231ps_fma(auVar113,auVar105,ZEXT1632(auVar75));
    auVar90 = vfmadd231ps_fma(auVar114,auVar105,auVar107);
    auVar79 = vfmadd231ps_fma(auVar118,auVar105,auVar108);
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar174 * auVar84._12_4_,
                                                 CONCAT48(fVar173 * auVar84._8_4_,
                                                          CONCAT44(fVar172 * auVar84._4_4_,
                                                                   fVar157 * auVar84._0_4_)))),
                              auVar105,ZEXT1632(auVar88));
    auVar113 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar89._12_4_ * fVar174,
                                             CONCAT48(auVar89._8_4_ * fVar173,
                                                      CONCAT44(auVar89._4_4_ * fVar172,
                                                               auVar89._0_4_ * fVar157)))),auVar105,
                          auVar115);
    auVar114 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar90._12_4_ * fVar174,
                                             CONCAT48(auVar90._8_4_ * fVar173,
                                                      CONCAT44(auVar90._4_4_ * fVar172,
                                                               auVar90._0_4_ * fVar157)))),auVar105,
                          auVar116);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar174,
                                             CONCAT48(auVar79._8_4_ * fVar173,
                                                      CONCAT44(auVar79._4_4_ * fVar172,
                                                               auVar79._0_4_ * fVar157)))),auVar117,
                          auVar105);
    auVar105 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar88));
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar89),auVar115);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar90),auVar116);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar79),auVar117);
    auVar132._0_4_ = fVar176 * auVar105._0_4_ * 3.0;
    auVar132._4_4_ = fVar176 * auVar105._4_4_ * 3.0;
    auVar132._8_4_ = fVar176 * auVar105._8_4_ * 3.0;
    auVar132._12_4_ = fVar176 * auVar105._12_4_ * 3.0;
    auVar132._16_4_ = fVar176 * auVar105._16_4_ * 3.0;
    auVar132._20_4_ = fVar176 * auVar105._20_4_ * 3.0;
    auVar132._24_4_ = fVar176 * auVar105._24_4_ * 3.0;
    auVar132._28_4_ = 0;
    auVar133._0_4_ = fVar176 * auVar107._0_4_ * 3.0;
    auVar133._4_4_ = fVar176 * auVar107._4_4_ * 3.0;
    auVar133._8_4_ = fVar176 * auVar107._8_4_ * 3.0;
    auVar133._12_4_ = fVar176 * auVar107._12_4_ * 3.0;
    auVar133._16_4_ = fVar176 * auVar107._16_4_ * 3.0;
    auVar133._20_4_ = fVar176 * auVar107._20_4_ * 3.0;
    auVar133._24_4_ = fVar176 * auVar107._24_4_ * 3.0;
    auVar133._28_4_ = 0;
    auVar115._4_4_ = fVar176 * auVar108._4_4_ * 3.0;
    auVar115._0_4_ = fVar176 * auVar108._0_4_ * 3.0;
    auVar115._8_4_ = fVar176 * auVar108._8_4_ * 3.0;
    auVar115._12_4_ = fVar176 * auVar108._12_4_ * 3.0;
    auVar115._16_4_ = fVar176 * auVar108._16_4_ * 3.0;
    auVar115._20_4_ = fVar176 * auVar108._20_4_ * 3.0;
    auVar115._24_4_ = fVar176 * auVar108._24_4_ * 3.0;
    auVar115._28_4_ = auVar111._28_4_;
    fVar157 = auVar106._0_4_ * 3.0 * fVar176;
    fVar172 = auVar106._4_4_ * 3.0 * fVar176;
    auVar116._4_4_ = fVar172;
    auVar116._0_4_ = fVar157;
    fVar173 = auVar106._8_4_ * 3.0 * fVar176;
    auVar116._8_4_ = fVar173;
    fVar174 = auVar106._12_4_ * 3.0 * fVar176;
    auVar116._12_4_ = fVar174;
    fVar175 = auVar106._16_4_ * 3.0 * fVar176;
    auVar116._16_4_ = fVar175;
    fVar177 = auVar106._20_4_ * 3.0 * fVar176;
    auVar116._20_4_ = fVar177;
    fVar178 = auVar106._24_4_ * 3.0 * fVar176;
    auVar116._24_4_ = fVar178;
    auVar116._28_4_ = fVar176;
    auVar88 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
    auVar118 = vpermt2ps_avx512vl(ZEXT1632(auVar75),_DAT_01fb9fc0,ZEXT1632(auVar88));
    auVar119 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,ZEXT1632(auVar88));
    auVar107 = ZEXT1632(auVar88);
    auVar120 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar107);
    auVar121._0_4_ = auVar103._0_4_ + fVar157;
    auVar121._4_4_ = auVar103._4_4_ + fVar172;
    auVar121._8_4_ = auVar103._8_4_ + fVar173;
    auVar121._12_4_ = auVar103._12_4_ + fVar174;
    auVar121._16_4_ = auVar103._16_4_ + fVar175;
    auVar121._20_4_ = auVar103._20_4_ + fVar177;
    auVar121._24_4_ = auVar103._24_4_ + fVar178;
    auVar121._28_4_ = auVar103._28_4_ + fVar176;
    auVar105 = vmaxps_avx(auVar103,auVar121);
    auVar109 = vminps_avx512vl(auVar103,auVar121);
    auVar110 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar107);
    auVar121 = vpermt2ps_avx512vl(auVar132,_DAT_01fb9fc0,auVar107);
    auVar122 = vpermt2ps_avx512vl(auVar133,_DAT_01fb9fc0,auVar107);
    auVar129 = ZEXT1632(auVar88);
    auVar123 = vpermt2ps_avx512vl(auVar115,_DAT_01fb9fc0,auVar129);
    auVar103 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar129);
    auVar103 = vsubps_avx(auVar110,auVar103);
    auVar107 = vsubps_avx(auVar118,ZEXT1632(auVar75));
    auVar108 = vsubps_avx(auVar119,auVar113);
    auVar106 = vsubps_avx(auVar120,auVar114);
    auVar111 = vmulps_avx512vl(auVar108,auVar115);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar133,auVar106);
    auVar112 = vmulps_avx512vl(auVar106,auVar132);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar115,auVar107);
    auVar116 = vmulps_avx512vl(auVar107,auVar133);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar132,auVar108);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar112 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar106,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar107);
    auVar116 = vrcp14ps_avx512vl(auVar112);
    auVar117 = vfnmadd213ps_avx512vl(auVar116,auVar112,auVar104);
    auVar116 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar116);
    auVar111 = vmulps_avx512vl(auVar111,auVar116);
    auVar117 = vmulps_avx512vl(auVar108,auVar123);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar122,auVar106);
    auVar124 = vmulps_avx512vl(auVar106,auVar121);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar123,auVar107);
    auVar125 = vmulps_avx512vl(auVar107,auVar122);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar121,auVar108);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar117 = vfmadd231ps_avx512vl(auVar124,auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar111 = vmaxps_avx512vl(auVar111,auVar116);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar116 = vmaxps_avx512vl(auVar103,auVar110);
    auVar105 = vmaxps_avx512vl(auVar105,auVar116);
    auVar116 = vaddps_avx512vl(auVar111,auVar105);
    auVar105 = vminps_avx(auVar103,auVar110);
    auVar105 = vminps_avx512vl(auVar109,auVar105);
    auVar105 = vsubps_avx512vl(auVar105,auVar111);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar116,auVar103);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar105 = vmulps_avx512vl(auVar105,auVar109);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar109 = vrsqrt14ps_avx512vl(auVar112);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar110 = vmulps_avx512vl(auVar112,auVar110);
    fVar157 = auVar109._0_4_;
    fVar172 = auVar109._4_4_;
    fVar173 = auVar109._8_4_;
    fVar174 = auVar109._12_4_;
    fVar176 = auVar109._16_4_;
    fVar175 = auVar109._20_4_;
    fVar177 = auVar109._24_4_;
    auVar117._4_4_ = fVar172 * fVar172 * fVar172 * auVar110._4_4_;
    auVar117._0_4_ = fVar157 * fVar157 * fVar157 * auVar110._0_4_;
    auVar117._8_4_ = fVar173 * fVar173 * fVar173 * auVar110._8_4_;
    auVar117._12_4_ = fVar174 * fVar174 * fVar174 * auVar110._12_4_;
    auVar117._16_4_ = fVar176 * fVar176 * fVar176 * auVar110._16_4_;
    auVar117._20_4_ = fVar175 * fVar175 * fVar175 * auVar110._20_4_;
    auVar117._24_4_ = fVar177 * fVar177 * fVar177 * auVar110._24_4_;
    auVar117._28_4_ = auVar116._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_avx512vl(auVar117,auVar109,auVar111);
    auVar263 = ZEXT3264(auVar109);
    auVar110 = vmulps_avx512vl(auVar107,auVar109);
    auVar111 = vmulps_avx512vl(auVar108,auVar109);
    auVar112 = vmulps_avx512vl(auVar106,auVar109);
    auVar225 = ZEXT1632(auVar75);
    auVar116 = vsubps_avx512vl(auVar129,auVar225);
    auVar117 = vsubps_avx512vl(auVar129,auVar113);
    auVar124 = vsubps_avx512vl(auVar129,auVar114);
    auVar125 = vmulps_avx512vl(auVar266._0_32_,auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar125,local_400,auVar117);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar265._0_32_,auVar116);
    auVar126 = vmulps_avx512vl(auVar124,auVar124);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar117,auVar117);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar116,auVar116);
    auVar127 = vmulps_avx512vl(auVar266._0_32_,auVar112);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar111,local_400);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar110,auVar265._0_32_);
    auVar112 = vmulps_avx512vl(auVar124,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar117,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar116,auVar110);
    auVar111 = vmulps_avx512vl(auVar127,auVar127);
    auVar128 = vsubps_avx512vl(local_220,auVar111);
    auVar112 = vmulps_avx512vl(auVar127,auVar110);
    auVar112 = vsubps_avx512vl(auVar125,auVar112);
    auVar125 = vaddps_avx512vl(auVar112,auVar112);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar126 = vsubps_avx512vl(auVar126,auVar112);
    auVar103 = vsubps_avx512vl(auVar126,auVar103);
    local_540 = vmulps_avx512vl(auVar125,auVar125);
    auVar112._8_4_ = 0x40800000;
    auVar112._0_8_ = 0x4080000040800000;
    auVar112._12_4_ = 0x40800000;
    auVar112._16_4_ = 0x40800000;
    auVar112._20_4_ = 0x40800000;
    auVar112._24_4_ = 0x40800000;
    auVar112._28_4_ = 0x40800000;
    _local_560 = vmulps_avx512vl(auVar128,auVar112);
    auVar112 = vmulps_avx512vl(_local_560,auVar103);
    auVar112 = vsubps_avx512vl(local_540,auVar112);
    uVar67 = vcmpps_avx512vl(auVar112,auVar129,5);
    bVar56 = (byte)uVar67;
    if (bVar56 == 0) {
LAB_0190e3bf:
      auVar239 = ZEXT3264(_DAT_01f7b040);
      auVar266 = ZEXT3264(local_7a0);
      auVar265 = ZEXT3264(local_780);
      auVar255 = ZEXT3264(local_840);
      auVar252 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_7e0);
      auVar228 = ZEXT3264(local_760);
      auVar245 = ZEXT3264(local_820);
      auVar105 = vmovdqa64_avx512vl(auVar93);
      auVar264 = ZEXT3264(auVar105);
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      local_580 = vaddps_avx512vl(auVar128,auVar128);
      local_5a0 = vrcp14ps_avx512vl(local_580);
      auVar104 = vfnmadd213ps_avx512vl(local_5a0,local_580,auVar104);
      auVar129 = vfmadd132ps_avx512vl(auVar104,local_5a0,local_5a0);
      auVar104._8_4_ = 0x80000000;
      auVar104._0_8_ = 0x8000000080000000;
      auVar104._12_4_ = 0x80000000;
      auVar104._16_4_ = 0x80000000;
      auVar104._20_4_ = 0x80000000;
      auVar104._24_4_ = 0x80000000;
      auVar104._28_4_ = 0x80000000;
      local_5c0 = vxorps_avx512vl(auVar125,auVar104);
      auVar104 = vsubps_avx512vl(local_5c0,auVar112);
      local_720 = vmulps_avx512vl(auVar104,auVar129);
      auVar112 = vsubps_avx512vl(auVar112,auVar125);
      local_5e0 = vmulps_avx512vl(auVar112,auVar129);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104 = vblendmps_avx512vl(auVar112,local_720);
      auVar130._0_4_ =
           (uint)(bVar56 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar112._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar66 * auVar104._4_4_ | (uint)!bVar66 * auVar112._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar66 * auVar104._8_4_ | (uint)!bVar66 * auVar112._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar66 * auVar104._12_4_ | (uint)!bVar66 * auVar112._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar130._16_4_ = (uint)bVar66 * auVar104._16_4_ | (uint)!bVar66 * auVar112._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar130._20_4_ = (uint)bVar66 * auVar104._20_4_ | (uint)!bVar66 * auVar112._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar130._24_4_ = (uint)bVar66 * auVar104._24_4_ | (uint)!bVar66 * auVar112._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar130._28_4_ = (uint)bVar66 * auVar104._28_4_ | (uint)!bVar66 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar112,local_5e0);
      auVar131._0_4_ =
           (uint)(bVar56 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar112._0_4_;
      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar66 * auVar104._4_4_ | (uint)!bVar66 * auVar112._4_4_;
      bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar66 * auVar104._8_4_ | (uint)!bVar66 * auVar112._8_4_;
      bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar66 * auVar104._12_4_ | (uint)!bVar66 * auVar112._12_4_;
      bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar66 * auVar104._16_4_ | (uint)!bVar66 * auVar112._16_4_;
      bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar66 * auVar104._20_4_ | (uint)!bVar66 * auVar112._20_4_;
      bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar66 * auVar104._24_4_ | (uint)!bVar66 * auVar112._24_4_;
      bVar66 = SUB81(uVar67 >> 7,0);
      auVar131._28_4_ = (uint)bVar66 * auVar104._28_4_ | (uint)!bVar66 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar112);
      local_740 = vmaxps_avx512vl(local_240,auVar112);
      auVar129._8_4_ = 0x36000000;
      auVar129._0_8_ = 0x3600000036000000;
      auVar129._12_4_ = 0x36000000;
      auVar129._16_4_ = 0x36000000;
      auVar129._20_4_ = 0x36000000;
      auVar129._24_4_ = 0x36000000;
      auVar129._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_740,auVar129);
      vandps_avx512vl(auVar128,auVar112);
      uVar60 = vcmpps_avx512vl(local_600,local_600,1);
      uVar67 = uVar67 & uVar60;
      bVar64 = (byte)uVar67;
      if (bVar64 != 0) {
        uVar60 = vcmpps_avx512vl(auVar103,_DAT_01f7b000,2);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar103,auVar111);
        bVar62 = (byte)uVar60;
        uVar68 = (uint)(bVar62 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar62 & 1) * local_600._0_4_;
        bVar66 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar138 = (uint)bVar66 * auVar112._4_4_ | (uint)!bVar66 * local_600._4_4_;
        bVar66 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar139 = (uint)bVar66 * auVar112._8_4_ | (uint)!bVar66 * local_600._8_4_;
        bVar66 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar140 = (uint)bVar66 * auVar112._12_4_ | (uint)!bVar66 * local_600._12_4_;
        bVar66 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar141 = (uint)bVar66 * auVar112._16_4_ | (uint)!bVar66 * local_600._16_4_;
        bVar66 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar142 = (uint)bVar66 * auVar112._20_4_ | (uint)!bVar66 * local_600._20_4_;
        bVar66 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar143 = (uint)bVar66 * auVar112._24_4_ | (uint)!bVar66 * local_600._24_4_;
        bVar66 = SUB81(uVar60 >> 7,0);
        uVar144 = (uint)bVar66 * auVar112._28_4_ | (uint)!bVar66 * local_600._28_4_;
        auVar130._0_4_ = (bVar64 & 1) * uVar68 | !(bool)(bVar64 & 1) * auVar130._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar130._4_4_ = bVar66 * uVar138 | !bVar66 * auVar130._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar130._8_4_ = bVar66 * uVar139 | !bVar66 * auVar130._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar130._12_4_ = bVar66 * uVar140 | !bVar66 * auVar130._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar130._16_4_ = bVar66 * uVar141 | !bVar66 * auVar130._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar130._20_4_ = bVar66 * uVar142 | !bVar66 * auVar130._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar130._24_4_ = bVar66 * uVar143 | !bVar66 * auVar130._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar130._28_4_ = bVar66 * uVar144 | !bVar66 * auVar130._28_4_;
        auVar103 = vblendmps_avx512vl(auVar111,auVar103);
        bVar66 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar21 = SUB81(uVar60 >> 7,0);
        auVar131._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar62 & 1) * auVar103._0_4_ | !(bool)(bVar62 & 1) * uVar68) |
             !(bool)(bVar64 & 1) * auVar131._0_4_;
        bVar15 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar131._4_4_ =
             (uint)bVar15 * ((uint)bVar66 * auVar103._4_4_ | !bVar66 * uVar138) |
             !bVar15 * auVar131._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar131._8_4_ =
             (uint)bVar66 * ((uint)bVar16 * auVar103._8_4_ | !bVar16 * uVar139) |
             !bVar66 * auVar131._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar131._12_4_ =
             (uint)bVar66 * ((uint)bVar17 * auVar103._12_4_ | !bVar17 * uVar140) |
             !bVar66 * auVar131._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar131._16_4_ =
             (uint)bVar66 * ((uint)bVar18 * auVar103._16_4_ | !bVar18 * uVar141) |
             !bVar66 * auVar131._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar131._20_4_ =
             (uint)bVar66 * ((uint)bVar19 * auVar103._20_4_ | !bVar19 * uVar142) |
             !bVar66 * auVar131._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar131._24_4_ =
             (uint)bVar66 * ((uint)bVar20 * auVar103._24_4_ | !bVar20 * uVar143) |
             !bVar66 * auVar131._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar131._28_4_ =
             (uint)bVar66 * ((uint)bVar21 * auVar103._28_4_ | !bVar21 * uVar144) |
             !bVar66 * auVar131._28_4_;
        bVar56 = (~bVar64 | bVar62) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) goto LAB_0190e3bf;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar111 = vxorps_avx512vl(auVar123,auVar103);
      auVar112 = vxorps_avx512vl(auVar121,auVar103);
      auVar239 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar104 = vxorps_avx512vl(auVar122,auVar103);
      auVar88 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_6e0._0_4_));
      auVar121 = vbroadcastss_avx512vl(auVar88);
      auVar121 = vminps_avx512vl(auVar121,auVar131);
      auVar123._4_4_ = fStack_25c;
      auVar123._0_4_ = local_260;
      auVar123._8_4_ = fStack_258;
      auVar123._12_4_ = fStack_254;
      auVar123._16_4_ = fStack_250;
      auVar123._20_4_ = fStack_24c;
      auVar123._24_4_ = fStack_248;
      auVar123._28_4_ = fStack_244;
      auVar123 = vmaxps_avx512vl(auVar123,auVar130);
      auVar122 = vmulps_avx512vl(auVar124,auVar115);
      auVar117 = vfmadd213ps_avx512vl(auVar117,auVar133,auVar122);
      auVar88 = vfmadd213ps_fma(auVar116,auVar132,auVar117);
      auVar115 = vmulps_avx512vl(local_7a0,auVar115);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_400,auVar133);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_780,auVar132);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar116);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar25 = vcmpps_avx512vl(auVar116,auVar117,1);
      auVar124 = vxorps_avx512vl(ZEXT1632(auVar88),auVar103);
      auVar128 = vrcp14ps_avx512vl(auVar115);
      auVar132 = vxorps_avx512vl(auVar115,auVar103);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar128,auVar115,auVar133);
      auVar88 = vfmadd132ps_fma(auVar122,auVar128,auVar128);
      fVar157 = auVar88._0_4_ * auVar124._0_4_;
      fVar172 = auVar88._4_4_ * auVar124._4_4_;
      auVar122._4_4_ = fVar172;
      auVar122._0_4_ = fVar157;
      fVar173 = auVar88._8_4_ * auVar124._8_4_;
      auVar122._8_4_ = fVar173;
      fVar174 = auVar88._12_4_ * auVar124._12_4_;
      auVar122._12_4_ = fVar174;
      fVar176 = auVar124._16_4_ * 0.0;
      auVar122._16_4_ = fVar176;
      fVar175 = auVar124._20_4_ * 0.0;
      auVar122._20_4_ = fVar175;
      fVar177 = auVar124._24_4_ * 0.0;
      auVar122._24_4_ = fVar177;
      auVar122._28_4_ = auVar124._28_4_;
      uVar27 = vcmpps_avx512vl(auVar115,auVar132,1);
      bVar64 = (byte)uVar25 | (byte)uVar27;
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar122,auVar129);
      auVar134._0_4_ =
           (uint)(bVar64 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar128._0_4_;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar66 * auVar122._4_4_ | (uint)!bVar66 * auVar128._4_4_;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar66 * auVar122._8_4_ | (uint)!bVar66 * auVar128._8_4_;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar66 * auVar122._12_4_ | (uint)!bVar66 * auVar128._12_4_;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar66 * auVar122._16_4_ | (uint)!bVar66 * auVar128._16_4_;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar66 * auVar122._20_4_ | (uint)!bVar66 * auVar128._20_4_;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar66 * auVar122._24_4_ | (uint)!bVar66 * auVar128._24_4_;
      auVar134._28_4_ =
           (uint)(bVar64 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar128._28_4_;
      auVar122 = vmaxps_avx512vl(auVar123,auVar134);
      uVar27 = vcmpps_avx512vl(auVar115,auVar132,6);
      bVar64 = (byte)uVar25 | (byte)uVar27;
      auVar128._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar157;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar172;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar173;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar174;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar176;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar175;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar177;
      auVar128._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar124._28_4_;
      auVar115 = vminps_avx512vl(auVar121,auVar128);
      auVar88 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar88),auVar118);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar88),auVar119);
      auVar121 = ZEXT1632(auVar88);
      auVar120 = vsubps_avx512vl(auVar121,auVar120);
      auVar120 = vmulps_avx512vl(auVar120,auVar111);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar104,auVar119);
      auVar118 = vfmadd231ps_avx512vl(auVar119,auVar112,auVar118);
      auVar111 = vmulps_avx512vl(local_7a0,auVar111);
      auVar111 = vfmadd231ps_avx512vl(auVar111,local_400,auVar104);
      auVar111 = vfmadd231ps_avx512vl(auVar111,local_780,auVar112);
      vandps_avx512vl(auVar111,auVar116);
      uVar25 = vcmpps_avx512vl(auVar111,auVar117,1);
      auVar112 = vxorps_avx512vl(auVar118,auVar103);
      auVar118 = vrcp14ps_avx512vl(auVar111);
      auVar103 = vxorps_avx512vl(auVar111,auVar103);
      auVar116 = vfnmadd213ps_avx512vl(auVar118,auVar111,auVar133);
      auVar88 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
      fVar157 = auVar88._0_4_ * auVar112._0_4_;
      fVar172 = auVar88._4_4_ * auVar112._4_4_;
      auVar119._4_4_ = fVar172;
      auVar119._0_4_ = fVar157;
      fVar173 = auVar88._8_4_ * auVar112._8_4_;
      auVar119._8_4_ = fVar173;
      fVar174 = auVar88._12_4_ * auVar112._12_4_;
      auVar119._12_4_ = fVar174;
      fVar176 = auVar112._16_4_ * 0.0;
      auVar119._16_4_ = fVar176;
      fVar175 = auVar112._20_4_ * 0.0;
      auVar119._20_4_ = fVar175;
      fVar177 = auVar112._24_4_ * 0.0;
      auVar119._24_4_ = fVar177;
      auVar119._28_4_ = auVar112._28_4_;
      uVar27 = vcmpps_avx512vl(auVar111,auVar103,1);
      bVar64 = (byte)uVar25 | (byte)uVar27;
      auVar116 = vblendmps_avx512vl(auVar119,auVar129);
      auVar120._0_4_ =
           (uint)(bVar64 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar118._0_4_;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar66 * auVar116._4_4_ | (uint)!bVar66 * auVar118._4_4_;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar66 * auVar116._8_4_ | (uint)!bVar66 * auVar118._8_4_;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar66 * auVar116._12_4_ | (uint)!bVar66 * auVar118._12_4_;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar66 * auVar116._16_4_ | (uint)!bVar66 * auVar118._16_4_;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar66 * auVar116._20_4_ | (uint)!bVar66 * auVar118._20_4_;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar66 * auVar116._24_4_ | (uint)!bVar66 * auVar118._24_4_;
      auVar120._28_4_ =
           (uint)(bVar64 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar118._28_4_;
      local_520 = vmaxps_avx(auVar122,auVar120);
      uVar27 = vcmpps_avx512vl(auVar111,auVar103,6);
      bVar64 = (byte)uVar25 | (byte)uVar27;
      auVar124._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar157;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar172;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar173;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar174;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar176;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar175;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar177;
      auVar124._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar112._28_4_;
      local_2a0 = vminps_avx(auVar115,auVar124);
      uVar25 = vcmpps_avx512vl(local_520,local_2a0,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar25;
      if (bVar56 == 0) {
        auVar267 = ZEXT3264(local_8a0);
        goto LAB_0190e3bf;
      }
      auVar103 = vmaxps_avx512vl(auVar121,auVar105);
      auVar105 = vfmadd213ps_avx512vl(local_720,auVar127,auVar110);
      fVar157 = auVar109._0_4_;
      fVar172 = auVar109._4_4_;
      auVar42._4_4_ = fVar172 * auVar105._4_4_;
      auVar42._0_4_ = fVar157 * auVar105._0_4_;
      fVar173 = auVar109._8_4_;
      auVar42._8_4_ = fVar173 * auVar105._8_4_;
      fVar174 = auVar109._12_4_;
      auVar42._12_4_ = fVar174 * auVar105._12_4_;
      fVar176 = auVar109._16_4_;
      auVar42._16_4_ = fVar176 * auVar105._16_4_;
      fVar175 = auVar109._20_4_;
      auVar42._20_4_ = fVar175 * auVar105._20_4_;
      fVar177 = auVar109._24_4_;
      auVar42._24_4_ = fVar177 * auVar105._24_4_;
      auVar42._28_4_ = auVar105._28_4_;
      auVar105 = vfmadd213ps_avx512vl(local_5e0,auVar127,auVar110);
      auVar43._4_4_ = fVar172 * auVar105._4_4_;
      auVar43._0_4_ = fVar157 * auVar105._0_4_;
      auVar43._8_4_ = fVar173 * auVar105._8_4_;
      auVar43._12_4_ = fVar174 * auVar105._12_4_;
      auVar43._16_4_ = fVar176 * auVar105._16_4_;
      auVar43._20_4_ = fVar175 * auVar105._20_4_;
      auVar43._24_4_ = fVar177 * auVar105._24_4_;
      auVar43._28_4_ = auVar105._28_4_;
      auVar105 = vminps_avx512vl(auVar42,auVar133);
      auVar49 = ZEXT812(0);
      auVar111 = ZEXT1232(auVar49) << 0x20;
      auVar105 = vmaxps_avx(auVar105,ZEXT1232(auVar49) << 0x20);
      auVar112 = vminps_avx512vl(auVar43,auVar133);
      auVar44._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar105._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar44,auVar216,auVar196);
      auVar105 = vmaxps_avx(auVar112,ZEXT1232(auVar49) << 0x20);
      auVar45._4_4_ = (auVar105._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar105._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar105._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar105._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar105._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar105._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar105._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar105._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar45,auVar216,auVar196);
      auVar46._4_4_ = auVar103._4_4_ * auVar103._4_4_;
      auVar46._0_4_ = auVar103._0_4_ * auVar103._0_4_;
      auVar46._8_4_ = auVar103._8_4_ * auVar103._8_4_;
      auVar46._12_4_ = auVar103._12_4_ * auVar103._12_4_;
      auVar46._16_4_ = auVar103._16_4_ * auVar103._16_4_;
      auVar46._20_4_ = auVar103._20_4_ * auVar103._20_4_;
      auVar46._24_4_ = auVar103._24_4_ * auVar103._24_4_;
      auVar46._28_4_ = auVar103._28_4_;
      auVar105 = vsubps_avx(auVar126,auVar46);
      auVar126._4_4_ = auVar105._4_4_ * (float)local_560._4_4_;
      auVar126._0_4_ = auVar105._0_4_ * (float)local_560._0_4_;
      auVar126._8_4_ = auVar105._8_4_ * fStack_558;
      auVar126._12_4_ = auVar105._12_4_ * fStack_554;
      auVar126._16_4_ = auVar105._16_4_ * fStack_550;
      auVar126._20_4_ = auVar105._20_4_ * fStack_54c;
      auVar126._24_4_ = auVar105._24_4_ * fStack_548;
      auVar126._28_4_ = auVar103._28_4_;
      auVar103 = vsubps_avx(local_540,auVar126);
      uVar25 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar49) << 0x20,5);
      bVar64 = (byte)uVar25;
      auVar267 = ZEXT3264(local_8a0);
      if (bVar64 == 0) {
        bVar64 = 0;
        auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
      }
      else {
        uVar67 = vcmpps_avx512vl(auVar103,auVar121,5);
        auVar103 = vsqrtps_avx(auVar103);
        auVar111 = vfnmadd213ps_avx512vl(local_580,local_5a0,auVar133);
        auVar88 = vfmadd132ps_fma(auVar111,local_5a0,local_5a0);
        auVar111 = vsubps_avx(local_5c0,auVar103);
        auVar47._4_4_ = auVar88._4_4_ * auVar111._4_4_;
        auVar47._0_4_ = auVar88._0_4_ * auVar111._0_4_;
        auVar47._8_4_ = auVar88._8_4_ * auVar111._8_4_;
        auVar47._12_4_ = auVar88._12_4_ * auVar111._12_4_;
        auVar47._16_4_ = auVar111._16_4_ * 0.0;
        auVar47._20_4_ = auVar111._20_4_ * 0.0;
        auVar47._24_4_ = auVar111._24_4_ * 0.0;
        auVar47._28_4_ = 0x3e000000;
        auVar103 = vsubps_avx512vl(auVar103,auVar125);
        auVar48._4_4_ = auVar88._4_4_ * auVar103._4_4_;
        auVar48._0_4_ = auVar88._0_4_ * auVar103._0_4_;
        auVar48._8_4_ = auVar88._8_4_ * auVar103._8_4_;
        auVar48._12_4_ = auVar88._12_4_ * auVar103._12_4_;
        auVar48._16_4_ = auVar103._16_4_ * 0.0;
        auVar48._20_4_ = auVar103._20_4_ * 0.0;
        auVar48._24_4_ = auVar103._24_4_ * 0.0;
        auVar48._28_4_ = auVar196._0_4_;
        auVar103 = vfmadd213ps_avx512vl(auVar127,auVar47,auVar110);
        auVar254._0_4_ = fVar157 * auVar103._0_4_;
        auVar254._4_4_ = fVar172 * auVar103._4_4_;
        auVar254._8_4_ = fVar173 * auVar103._8_4_;
        auVar254._12_4_ = fVar174 * auVar103._12_4_;
        auVar254._16_4_ = fVar176 * auVar103._16_4_;
        auVar254._20_4_ = fVar175 * auVar103._20_4_;
        auVar254._24_4_ = fVar177 * auVar103._24_4_;
        auVar254._28_4_ = 0;
        auVar103 = vmulps_avx512vl(local_780,auVar47);
        auVar111 = vmulps_avx512vl(local_400,auVar47);
        auVar115 = vmulps_avx512vl(local_7a0,auVar47);
        auVar112 = vfmadd213ps_avx512vl(auVar107,auVar254,auVar225);
        auVar112 = vsubps_avx512vl(auVar103,auVar112);
        auVar103 = vfmadd213ps_avx512vl(auVar108,auVar254,auVar113);
        auVar118 = vsubps_avx512vl(auVar111,auVar103);
        auVar88 = vfmadd213ps_fma(auVar254,auVar106,auVar114);
        auVar103 = vsubps_avx(auVar115,ZEXT1632(auVar88));
        auVar110 = vfmadd213ps_avx512vl(auVar127,auVar48,auVar110);
        auVar109 = vmulps_avx512vl(auVar109,auVar110);
        auVar263 = ZEXT3264(auVar109);
        auVar110 = vmulps_avx512vl(local_780,auVar48);
        auVar115 = vmulps_avx512vl(local_400,auVar48);
        auVar116 = vmulps_avx512vl(local_7a0,auVar48);
        auVar88 = vfmadd213ps_fma(auVar107,auVar109,auVar225);
        auVar111 = vsubps_avx(auVar110,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar108,auVar109,auVar113);
        auVar107 = vsubps_avx512vl(auVar115,ZEXT1632(auVar88));
        auVar88 = vfmadd213ps_fma(auVar106,auVar109,auVar114);
        auVar108 = vsubps_avx512vl(auVar116,ZEXT1632(auVar88));
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar106 = vblendmps_avx512vl(auVar197,auVar47);
        bVar66 = (bool)((byte)uVar67 & 1);
        auVar125._0_4_ = (uint)bVar66 * auVar106._0_4_ | (uint)!bVar66 * auVar75._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar66 * auVar106._4_4_ | (uint)!bVar66 * auVar75._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar66 * auVar106._8_4_ | (uint)!bVar66 * auVar75._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar66 * auVar106._12_4_ | (uint)!bVar66 * auVar75._12_4_;
        iVar1 = (uint)((byte)(uVar67 >> 4) & 1) * auVar106._16_4_;
        auVar125._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar67 >> 5) & 1) * auVar106._20_4_;
        auVar125._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar67 >> 6) & 1) * auVar106._24_4_;
        auVar125._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar67 >> 7) * auVar106._28_4_;
        auVar125._28_4_ = iVar4;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar106 = vblendmps_avx512vl(auVar198,auVar48);
        bVar66 = (bool)((byte)uVar67 & 1);
        auVar127._0_4_ = (uint)bVar66 * auVar106._0_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar66 * auVar106._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar66 * auVar106._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar66 * auVar106._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar66 * auVar106._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar66 * auVar106._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar66 * auVar106._24_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = SUB81(uVar67 >> 7,0);
        auVar127._28_4_ = (uint)bVar66 * auVar106._28_4_ | (uint)!bVar66 * -0x800000;
        auVar225._8_4_ = 0x36000000;
        auVar225._0_8_ = 0x3600000036000000;
        auVar225._12_4_ = 0x36000000;
        auVar225._16_4_ = 0x36000000;
        auVar225._20_4_ = 0x36000000;
        auVar225._24_4_ = 0x36000000;
        auVar225._28_4_ = 0x36000000;
        auVar106 = vmulps_avx512vl(local_740,auVar225);
        uVar60 = vcmpps_avx512vl(auVar106,local_600,0xe);
        uVar67 = uVar67 & uVar60;
        bVar62 = (byte)uVar67;
        if (bVar62 != 0) {
          uVar60 = vcmpps_avx512vl(auVar105,_DAT_01f7b000,2);
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar105 = vblendmps_avx512vl(auVar251,auVar259);
          bVar57 = (byte)uVar60;
          uVar68 = (uint)(bVar57 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar106._0_4_;
          bVar66 = (bool)((byte)(uVar60 >> 1) & 1);
          uVar138 = (uint)bVar66 * auVar105._4_4_ | (uint)!bVar66 * auVar106._4_4_;
          bVar66 = (bool)((byte)(uVar60 >> 2) & 1);
          uVar139 = (uint)bVar66 * auVar105._8_4_ | (uint)!bVar66 * auVar106._8_4_;
          bVar66 = (bool)((byte)(uVar60 >> 3) & 1);
          uVar140 = (uint)bVar66 * auVar105._12_4_ | (uint)!bVar66 * auVar106._12_4_;
          bVar66 = (bool)((byte)(uVar60 >> 4) & 1);
          uVar141 = (uint)bVar66 * auVar105._16_4_ | (uint)!bVar66 * auVar106._16_4_;
          bVar66 = (bool)((byte)(uVar60 >> 5) & 1);
          uVar142 = (uint)bVar66 * auVar105._20_4_ | (uint)!bVar66 * auVar106._20_4_;
          bVar66 = (bool)((byte)(uVar60 >> 6) & 1);
          uVar143 = (uint)bVar66 * auVar105._24_4_ | (uint)!bVar66 * auVar106._24_4_;
          bVar66 = SUB81(uVar60 >> 7,0);
          uVar144 = (uint)bVar66 * auVar105._28_4_ | (uint)!bVar66 * auVar106._28_4_;
          auVar125._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar125._0_4_;
          bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar125._4_4_ = bVar66 * uVar138 | !bVar66 * auVar125._4_4_;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar125._8_4_ = bVar66 * uVar139 | !bVar66 * auVar125._8_4_;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar125._12_4_ = bVar66 * uVar140 | !bVar66 * auVar125._12_4_;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar125._16_4_ = bVar66 * uVar141 | (uint)!bVar66 * iVar1;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar125._20_4_ = bVar66 * uVar142 | (uint)!bVar66 * iVar2;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar125._24_4_ = bVar66 * uVar143 | (uint)!bVar66 * iVar3;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar125._28_4_ = bVar66 * uVar144 | (uint)!bVar66 * iVar4;
          auVar105 = vblendmps_avx512vl(auVar259,auVar251);
          bVar66 = (bool)((byte)(uVar60 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar60 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar60 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar60 >> 4) & 1);
          bVar19 = (bool)((byte)(uVar60 >> 5) & 1);
          bVar20 = (bool)((byte)(uVar60 >> 6) & 1);
          bVar21 = SUB81(uVar60 >> 7,0);
          auVar127._0_4_ =
               (uint)(bVar62 & 1) *
               ((uint)(bVar57 & 1) * auVar105._0_4_ | !(bool)(bVar57 & 1) * uVar68) |
               !(bool)(bVar62 & 1) * auVar127._0_4_;
          bVar15 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar127._4_4_ =
               (uint)bVar15 * ((uint)bVar66 * auVar105._4_4_ | !bVar66 * uVar138) |
               !bVar15 * auVar127._4_4_;
          bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar127._8_4_ =
               (uint)bVar66 * ((uint)bVar16 * auVar105._8_4_ | !bVar16 * uVar139) |
               !bVar66 * auVar127._8_4_;
          bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar127._12_4_ =
               (uint)bVar66 * ((uint)bVar17 * auVar105._12_4_ | !bVar17 * uVar140) |
               !bVar66 * auVar127._12_4_;
          bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar127._16_4_ =
               (uint)bVar66 * ((uint)bVar18 * auVar105._16_4_ | !bVar18 * uVar141) |
               !bVar66 * auVar127._16_4_;
          bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar127._20_4_ =
               (uint)bVar66 * ((uint)bVar19 * auVar105._20_4_ | !bVar19 * uVar142) |
               !bVar66 * auVar127._20_4_;
          bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar127._24_4_ =
               (uint)bVar66 * ((uint)bVar20 * auVar105._24_4_ | !bVar20 * uVar143) |
               !bVar66 * auVar127._24_4_;
          bVar66 = SUB81(uVar67 >> 7,0);
          auVar127._28_4_ =
               (uint)bVar66 * ((uint)bVar21 * auVar105._28_4_ | !bVar21 * uVar144) |
               !bVar66 * auVar127._28_4_;
          bVar64 = (~bVar62 | bVar57) & bVar64;
        }
      }
      auVar105 = vmovdqa64_avx512vl(auVar93);
      auVar264 = ZEXT3264(auVar105);
      auVar266 = ZEXT3264(local_7a0);
      auVar105 = vmulps_avx512vl(local_7a0,auVar108);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_400,auVar107);
      auVar265 = ZEXT3264(local_780);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_780,auVar111);
      _local_200 = local_520;
      local_1e0 = vminps_avx(local_2a0,auVar125);
      auVar249._8_4_ = 0x7fffffff;
      auVar249._0_8_ = 0x7fffffff7fffffff;
      auVar249._12_4_ = 0x7fffffff;
      auVar249._16_4_ = 0x7fffffff;
      auVar249._20_4_ = 0x7fffffff;
      auVar249._24_4_ = 0x7fffffff;
      auVar249._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar105,auVar249);
      _local_4e0 = vmaxps_avx(local_520,auVar127);
      _local_2c0 = _local_4e0;
      auVar244._8_4_ = 0x3e99999a;
      auVar244._0_8_ = 0x3e99999a3e99999a;
      auVar244._12_4_ = 0x3e99999a;
      auVar244._16_4_ = 0x3e99999a;
      auVar244._20_4_ = 0x3e99999a;
      auVar244._24_4_ = 0x3e99999a;
      auVar244._28_4_ = 0x3e99999a;
      uVar25 = vcmpps_avx512vl(auVar105,auVar244,1);
      uVar27 = vcmpps_avx512vl(local_520,local_1e0,2);
      bVar62 = (byte)uVar27 & bVar56;
      uVar26 = vcmpps_avx512vl(_local_4e0,local_2a0,2);
      if ((bVar56 & ((byte)uVar26 | (byte)uVar27)) == 0) {
        auVar239 = ZEXT3264(_DAT_01f7b040);
        auVar255 = ZEXT3264(local_840);
        auVar250 = ZEXT3264(local_7e0);
        auVar252 = ZEXT3264(local_800);
        auVar228 = ZEXT3264(local_760);
        auVar245 = ZEXT3264(local_820);
      }
      else {
        bVar57 = (byte)uVar25 | ~bVar64;
        auVar105 = vmulps_avx512vl(local_7a0,auVar103);
        auVar88 = vfmadd213ps_fma(auVar118,local_400,auVar105);
        auVar105 = vfmadd213ps_avx512vl(auVar112,local_780,ZEXT1632(auVar88));
        auVar105 = vandps_avx(auVar105,auVar249);
        uVar25 = vcmpps_avx512vl(auVar105,auVar244,1);
        bVar64 = (byte)uVar25 | ~bVar64;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar105 = vpblendmd_avx512vl(auVar152,auVar39);
        local_280._0_4_ = (uint)(bVar64 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar66 = (bool)(bVar64 >> 1 & 1);
        local_280._4_4_ = (uint)bVar66 * auVar105._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 2 & 1);
        local_280._8_4_ = (uint)bVar66 * auVar105._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 3 & 1);
        local_280._12_4_ = (uint)bVar66 * auVar105._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 4 & 1);
        local_280._16_4_ = (uint)bVar66 * auVar105._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 5 & 1);
        local_280._20_4_ = (uint)bVar66 * auVar105._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 6 & 1);
        local_280._24_4_ = (uint)bVar66 * auVar105._24_4_ | (uint)!bVar66 * 2;
        local_280._28_4_ = (uint)(bVar64 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        local_460 = vpbroadcastd_avx512vl();
        uVar25 = vpcmpd_avx512vl(local_460,local_280,5);
        local_4c0 = local_520._0_4_ + (float)local_500._0_4_;
        fStack_4bc = local_520._4_4_ + (float)local_500._4_4_;
        fStack_4b8 = local_520._8_4_ + fStack_4f8;
        fStack_4b4 = local_520._12_4_ + fStack_4f4;
        fStack_4b0 = local_520._16_4_ + fStack_4f0;
        fStack_4ac = local_520._20_4_ + fStack_4ec;
        fStack_4a8 = local_520._24_4_ + fStack_4e8;
        fStack_4a4 = local_520._28_4_ + fStack_4e4;
        for (bVar64 = (byte)uVar25 & bVar62; bVar64 != 0;
            bVar64 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar64 & (byte)uVar25) {
          auVar153._8_4_ = 0x7f800000;
          auVar153._0_8_ = 0x7f8000007f800000;
          auVar153._12_4_ = 0x7f800000;
          auVar153._16_4_ = 0x7f800000;
          auVar153._20_4_ = 0x7f800000;
          auVar153._24_4_ = 0x7f800000;
          auVar153._28_4_ = 0x7f800000;
          auVar105 = vblendmps_avx512vl(auVar153,local_520);
          auVar136._0_4_ =
               (uint)(bVar64 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 1 & 1);
          auVar136._4_4_ = (uint)bVar66 * auVar105._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 2 & 1);
          auVar136._8_4_ = (uint)bVar66 * auVar105._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 3 & 1);
          auVar136._12_4_ = (uint)bVar66 * auVar105._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 4 & 1);
          auVar136._16_4_ = (uint)bVar66 * auVar105._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 5 & 1);
          auVar136._20_4_ = (uint)bVar66 * auVar105._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar136._24_4_ =
               (uint)(bVar64 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar105 = vshufps_avx(auVar136,auVar136,0xb1);
          auVar105 = vminps_avx(auVar136,auVar105);
          auVar103 = vshufpd_avx(auVar105,auVar105,5);
          auVar105 = vminps_avx(auVar105,auVar103);
          auVar103 = vpermpd_avx2(auVar105,0x4e);
          auVar105 = vminps_avx(auVar105,auVar103);
          uVar25 = vcmpps_avx512vl(auVar136,auVar105,0);
          bVar58 = (byte)uVar25 & bVar64;
          bVar59 = bVar64;
          if (bVar58 != 0) {
            bVar59 = bVar58;
          }
          iVar2 = 0;
          for (uVar68 = (uint)bVar59; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar68 = *(uint *)(local_1a0 + (uint)(iVar2 << 2));
          uVar138 = *(uint *)(local_200 + (uint)(iVar2 << 2));
          fVar157 = auVar87._0_4_;
          if ((float)local_7c0._0_4_ < 0.0) {
            auVar263 = ZEXT1664(auVar263._0_16_);
            fVar157 = sqrtf((float)local_7c0._0_4_);
            auVar105 = vmovdqa64_avx512vl(auVar93);
            auVar264 = ZEXT3264(auVar105);
            auVar267 = ZEXT3264(local_8a0);
          }
          auVar84 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar88 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar89 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar90 = vminps_avx(auVar84,auVar89);
          auVar84 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar89 = vmaxps_avx(auVar88,auVar84);
          auVar202._8_4_ = 0x7fffffff;
          auVar202._0_8_ = 0x7fffffff7fffffff;
          auVar202._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar90,auVar202);
          auVar84 = vandps_avx(auVar89,auVar202);
          auVar88 = vmaxps_avx(auVar88,auVar84);
          auVar84 = vmovshdup_avx(auVar88);
          auVar84 = vmaxss_avx(auVar84,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar84);
          local_600._0_4_ = auVar88._0_4_ * 1.9073486e-06;
          local_870._0_4_ = fVar157 * 1.9073486e-06;
          local_6d0 = vshufps_avx(auVar89,auVar89,0xff);
          auVar88 = vinsertps_avx(ZEXT416(uVar138),ZEXT416(uVar68),0x10);
          auVar228 = ZEXT1664(auVar88);
          lVar61 = 5;
          do {
            do {
              bVar66 = lVar61 == 0;
              lVar61 = lVar61 + -1;
              if (bVar66) goto LAB_0190ef9c;
              fVar175 = auVar228._0_4_;
              auVar145._4_4_ = fVar175;
              auVar145._0_4_ = fVar175;
              auVar145._8_4_ = fVar175;
              auVar145._12_4_ = fVar175;
              auVar84 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_7b0);
              auVar79 = auVar228._0_16_;
              auVar88 = vmovshdup_avx(auVar79);
              local_580._0_16_ = auVar88;
              fVar176 = 1.0 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar79,auVar79,0x55);
              fVar157 = auVar88._0_4_;
              auVar182._0_4_ = local_660._0_4_ * fVar157;
              fVar172 = auVar88._4_4_;
              auVar182._4_4_ = local_660._4_4_ * fVar172;
              fVar173 = auVar88._8_4_;
              auVar182._8_4_ = local_660._8_4_ * fVar173;
              fVar174 = auVar88._12_4_;
              auVar182._12_4_ = local_660._12_4_ * fVar174;
              _local_560 = ZEXT416((uint)fVar176);
              auVar203._4_4_ = fVar176;
              auVar203._0_4_ = fVar176;
              auVar203._8_4_ = fVar176;
              auVar203._12_4_ = fVar176;
              auVar88 = vfmadd231ps_fma(auVar182,auVar203,local_620._0_16_);
              auVar221._0_4_ = local_640._0_4_ * fVar157;
              auVar221._4_4_ = local_640._4_4_ * fVar172;
              auVar221._8_4_ = local_640._8_4_ * fVar173;
              auVar221._12_4_ = local_640._12_4_ * fVar174;
              auVar89 = vfmadd231ps_fma(auVar221,auVar203,local_660._0_16_);
              auVar233._0_4_ = fVar157 * (float)local_680._0_4_;
              auVar233._4_4_ = fVar172 * (float)local_680._4_4_;
              auVar233._8_4_ = fVar173 * fStack_678;
              auVar233._12_4_ = fVar174 * fStack_674;
              auVar90 = vfmadd231ps_fma(auVar233,auVar203,local_640._0_16_);
              auVar242._0_4_ = fVar157 * auVar89._0_4_;
              auVar242._4_4_ = fVar172 * auVar89._4_4_;
              auVar242._8_4_ = fVar173 * auVar89._8_4_;
              auVar242._12_4_ = fVar174 * auVar89._12_4_;
              auVar88 = vfmadd231ps_fma(auVar242,auVar203,auVar88);
              auVar183._0_4_ = fVar157 * auVar90._0_4_;
              auVar183._4_4_ = fVar172 * auVar90._4_4_;
              auVar183._8_4_ = fVar173 * auVar90._8_4_;
              auVar183._12_4_ = fVar174 * auVar90._12_4_;
              auVar89 = vfmadd231ps_fma(auVar183,auVar203,auVar89);
              auVar222._0_4_ = fVar157 * auVar89._0_4_;
              auVar222._4_4_ = fVar172 * auVar89._4_4_;
              auVar222._8_4_ = fVar173 * auVar89._8_4_;
              auVar222._12_4_ = fVar174 * auVar89._12_4_;
              auVar90 = vfmadd231ps_fma(auVar222,auVar88,auVar203);
              auVar88 = vsubps_avx(auVar89,auVar88);
              auVar28._8_4_ = 0x40400000;
              auVar28._0_8_ = 0x4040000040400000;
              auVar28._12_4_ = 0x40400000;
              auVar89 = vmulps_avx512vl(auVar88,auVar28);
              local_540._0_16_ = auVar90;
              auVar84 = vsubps_avx(auVar84,auVar90);
              auVar88 = vdpps_avx(auVar84,auVar84,0x7f);
              fVar157 = auVar88._0_4_;
              if (fVar157 < 0.0) {
                auVar239._0_4_ = sqrtf(fVar157);
                auVar239._4_60_ = extraout_var;
                auVar90 = auVar239._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar88,auVar88);
              }
              local_5a0._0_16_ = vdpps_avx(auVar89,auVar89,0x7f);
              fVar172 = local_5a0._0_4_;
              auVar184._4_12_ = ZEXT812(0) << 0x20;
              auVar184._0_4_ = fVar172;
              local_740._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              fVar173 = local_740._0_4_;
              local_5c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(local_5a0._0_16_,auVar29);
              auVar75 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_5e0._0_4_ = auVar75._0_4_;
              local_720._0_4_ = auVar90._0_4_;
              if (fVar172 < auVar76._0_4_) {
                fVar174 = sqrtf(fVar172);
                auVar90 = ZEXT416((uint)local_720._0_4_);
              }
              else {
                auVar75 = vsqrtss_avx(local_5a0._0_16_,local_5a0._0_16_);
                fVar174 = auVar75._0_4_;
              }
              fVar176 = local_740._0_4_;
              fVar172 = fVar173 * 1.5 + fVar172 * -0.5 * fVar176 * fVar176 * fVar176;
              local_740._0_4_ = auVar89._0_4_ * fVar172;
              local_740._4_4_ = auVar89._4_4_ * fVar172;
              local_740._8_4_ = auVar89._8_4_ * fVar172;
              local_740._12_4_ = auVar89._12_4_ * fVar172;
              auVar75 = vdpps_avx(auVar84,local_740._0_16_,0x7f);
              fVar177 = auVar90._0_4_;
              fVar173 = auVar75._0_4_;
              auVar146._0_4_ = fVar173 * fVar173;
              auVar146._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar146._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar146._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar88 = vsubps_avx(auVar88,auVar146);
              fVar176 = auVar88._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar176;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              auVar77 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
              if (fVar176 < 0.0) {
                local_690._0_4_ = fVar174;
                local_6b0._0_4_ = auVar77._0_4_;
                local_6c0._4_4_ = fVar172;
                local_6c0._0_4_ = fVar172;
                fStack_6b8 = fVar172;
                fStack_6b4 = fVar172;
                local_6a0 = auVar76;
                fVar176 = sqrtf(fVar176);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar77 = ZEXT416((uint)local_6b0._0_4_);
                auVar90 = ZEXT416((uint)local_720._0_4_);
                auVar76 = local_6a0;
                fVar172 = (float)local_6c0._0_4_;
                fVar178 = (float)local_6c0._4_4_;
                fVar260 = fStack_6b8;
                fVar261 = fStack_6b4;
                fVar174 = (float)local_690._0_4_;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar176 = auVar88._0_4_;
                fVar178 = fVar172;
                fVar260 = fVar172;
                fVar261 = fVar172;
              }
              auVar263 = ZEXT1664(auVar75);
              auVar267 = ZEXT3264(local_8a0);
              auVar105 = vmovdqa64_avx512vl(auVar93);
              auVar264 = ZEXT3264(auVar105);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_560,local_580._0_16_);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_580._0_16_,_local_560);
              fVar179 = auVar88._0_4_ * 6.0;
              fVar23 = local_580._0_4_ * 6.0;
              auVar204._0_4_ = fVar23 * (float)local_680._0_4_;
              auVar204._4_4_ = fVar23 * (float)local_680._4_4_;
              auVar204._8_4_ = fVar23 * fStack_678;
              auVar204._12_4_ = fVar23 * fStack_674;
              auVar185._4_4_ = fVar179;
              auVar185._0_4_ = fVar179;
              auVar185._8_4_ = fVar179;
              auVar185._12_4_ = fVar179;
              auVar88 = vfmadd132ps_fma(auVar185,auVar204,local_640._0_16_);
              fVar179 = auVar80._0_4_ * 6.0;
              auVar163._4_4_ = fVar179;
              auVar163._0_4_ = fVar179;
              auVar163._8_4_ = fVar179;
              auVar163._12_4_ = fVar179;
              auVar88 = vfmadd132ps_fma(auVar163,auVar88,local_660._0_16_);
              fVar179 = local_560._0_4_ * 6.0;
              auVar186._4_4_ = fVar179;
              auVar186._0_4_ = fVar179;
              auVar186._8_4_ = fVar179;
              auVar186._12_4_ = fVar179;
              auVar88 = vfmadd132ps_fma(auVar186,auVar88,local_620._0_16_);
              auVar164._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
              auVar164._4_4_ = auVar88._4_4_ * (float)local_5a0._0_4_;
              auVar164._8_4_ = auVar88._8_4_ * (float)local_5a0._0_4_;
              auVar164._12_4_ = auVar88._12_4_ * (float)local_5a0._0_4_;
              auVar88 = vdpps_avx(auVar89,auVar88,0x7f);
              fVar179 = auVar88._0_4_;
              auVar187._0_4_ = auVar89._0_4_ * fVar179;
              auVar187._4_4_ = auVar89._4_4_ * fVar179;
              auVar187._8_4_ = auVar89._8_4_ * fVar179;
              auVar187._12_4_ = auVar89._12_4_ * fVar179;
              auVar88 = vsubps_avx(auVar164,auVar187);
              fVar179 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
              auVar80 = vmaxss_avx(ZEXT416((uint)local_600._0_4_),
                                   ZEXT416((uint)(fVar175 * (float)local_870._0_4_)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar89,auVar30);
              auVar188._0_4_ = fVar172 * auVar88._0_4_ * fVar179;
              auVar188._4_4_ = fVar178 * auVar88._4_4_ * fVar179;
              auVar188._8_4_ = fVar260 * auVar88._8_4_ * fVar179;
              auVar188._12_4_ = fVar261 * auVar88._12_4_ * fVar179;
              auVar88 = vdpps_avx(auVar82,local_740._0_16_,0x7f);
              auVar81 = vfmadd213ss_fma(auVar90,ZEXT416((uint)local_600._0_4_),auVar80);
              auVar90 = vdpps_avx(auVar84,auVar188,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar177 + 1.0)),
                                        ZEXT416((uint)((float)local_600._0_4_ / fVar174)),auVar81);
              fVar172 = auVar88._0_4_ + auVar90._0_4_;
              auVar88 = vdpps_avx(local_7b0,local_740._0_16_,0x7f);
              auVar90 = vdpps_avx(auVar84,auVar82,0x7f);
              auVar78 = vmulss_avx512f(auVar78,auVar76);
              auVar76 = vmulss_avx512f(auVar76,auVar76);
              auVar82 = vaddss_avx512f(auVar77,ZEXT416((uint)(auVar78._0_4_ * auVar76._0_4_)));
              auVar76 = vdpps_avx(auVar84,local_7b0,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar90,auVar75,ZEXT416((uint)fVar172));
              auVar76 = vfnmadd231ss_fma(auVar76,auVar75,auVar88);
              auVar90 = vpermilps_avx(local_540._0_16_,0xff);
              fVar176 = fVar176 - auVar90._0_4_;
              auVar77 = vshufps_avx(auVar89,auVar89,0xff);
              auVar90 = vfmsub213ss_fma(auVar78,auVar82,auVar77);
              auVar247._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar247._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar247._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar90._0_4_)),
                                        ZEXT416((uint)fVar172),auVar76);
              auVar90 = vinsertps_avx(auVar247,auVar76,0x1c);
              auVar234._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar76 = vinsertps_avx(ZEXT416((uint)fVar172),auVar234,0x10);
              auVar205._0_4_ = auVar78._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar88 = vdivps_avx(auVar90,auVar205);
              auVar90 = vdivps_avx(auVar76,auVar205);
              auVar206._0_4_ = fVar173 * auVar88._0_4_ + fVar176 * auVar90._0_4_;
              auVar206._4_4_ = fVar173 * auVar88._4_4_ + fVar176 * auVar90._4_4_;
              auVar206._8_4_ = fVar173 * auVar88._8_4_ + fVar176 * auVar90._8_4_;
              auVar206._12_4_ = fVar173 * auVar88._12_4_ + fVar176 * auVar90._12_4_;
              auVar88 = vsubps_avx(auVar79,auVar206);
              auVar228 = ZEXT1664(auVar88);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx512vl(auVar75,auVar31);
            } while (auVar81._0_4_ <= auVar90._0_4_);
            auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar80._0_4_)),local_6d0,
                                      ZEXT416(0x36000000));
            auVar32._8_4_ = 0x7fffffff;
            auVar32._0_8_ = 0x7fffffff7fffffff;
            auVar32._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(ZEXT416((uint)fVar176),auVar32);
          } while (auVar90._0_4_ <= auVar79._0_4_);
          fVar172 = auVar88._0_4_ + (float)local_6e0._0_4_;
          if ((fVar22 <= fVar172) && (fVar173 = *(float *)(ray + k * 4 + 0x100), fVar172 <= fVar173)
             ) {
            auVar90 = vmovshdup_avx(auVar88);
            fVar174 = auVar90._0_4_;
            if ((0.0 <= fVar174) && (fVar174 <= 1.0)) {
              auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar157));
              fVar176 = auVar90._0_4_;
              pGVar8 = (context->scene->geometries).items[uVar6].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar157 = fVar176 * 1.5 + fVar157 * -0.5 * fVar176 * fVar176 * fVar176;
                auVar207._0_4_ = auVar84._0_4_ * fVar157;
                auVar207._4_4_ = auVar84._4_4_ * fVar157;
                auVar207._8_4_ = auVar84._8_4_ * fVar157;
                auVar207._12_4_ = auVar84._12_4_ * fVar157;
                auVar79 = vfmadd213ps_fma(auVar77,auVar207,auVar89);
                auVar84 = vshufps_avx(auVar207,auVar207,0xc9);
                auVar90 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar208._0_4_ = auVar207._0_4_ * auVar90._0_4_;
                auVar208._4_4_ = auVar207._4_4_ * auVar90._4_4_;
                auVar208._8_4_ = auVar207._8_4_ * auVar90._8_4_;
                auVar208._12_4_ = auVar207._12_4_ * auVar90._12_4_;
                auVar90 = vfmsub231ps_fma(auVar208,auVar89,auVar84);
                auVar84 = vshufps_avx(auVar90,auVar90,0xc9);
                auVar89 = vshufps_avx(auVar79,auVar79,0xc9);
                auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                auVar147._0_4_ = auVar79._0_4_ * auVar90._0_4_;
                auVar147._4_4_ = auVar79._4_4_ * auVar90._4_4_;
                auVar147._8_4_ = auVar79._8_4_ * auVar90._8_4_;
                auVar147._12_4_ = auVar79._12_4_ * auVar90._12_4_;
                auVar84 = vfmsub231ps_fma(auVar147,auVar84,auVar89);
                uVar158 = auVar84._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x100) = fVar172;
                  uVar7 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                  uVar7 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar158;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(int *)(ray + k * 4 + 0x220) = (int)local_848;
                  *(uint *)(ray + k * 4 + 0x240) = uVar6;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  pRVar14 = context->user;
                  auVar217._8_4_ = 1;
                  auVar217._0_8_ = 0x100000001;
                  auVar217._12_4_ = 1;
                  auVar217._16_4_ = 1;
                  auVar217._20_4_ = 1;
                  auVar217._24_4_ = 1;
                  auVar217._28_4_ = 1;
                  local_380 = vpermps_avx2(auVar217,ZEXT1632(auVar88));
                  auVar105 = vpermps_avx2(auVar217,ZEXT1632(auVar84));
                  auVar226._8_4_ = 2;
                  auVar226._0_8_ = 0x200000002;
                  auVar226._12_4_ = 2;
                  auVar226._16_4_ = 2;
                  auVar226._20_4_ = 2;
                  auVar226._24_4_ = 2;
                  auVar226._28_4_ = 2;
                  local_3c0 = vpermps_avx2(auVar226,ZEXT1632(auVar84));
                  local_3e0[0] = (RTCHitN)auVar105[0];
                  local_3e0[1] = (RTCHitN)auVar105[1];
                  local_3e0[2] = (RTCHitN)auVar105[2];
                  local_3e0[3] = (RTCHitN)auVar105[3];
                  local_3e0[4] = (RTCHitN)auVar105[4];
                  local_3e0[5] = (RTCHitN)auVar105[5];
                  local_3e0[6] = (RTCHitN)auVar105[6];
                  local_3e0[7] = (RTCHitN)auVar105[7];
                  local_3e0[8] = (RTCHitN)auVar105[8];
                  local_3e0[9] = (RTCHitN)auVar105[9];
                  local_3e0[10] = (RTCHitN)auVar105[10];
                  local_3e0[0xb] = (RTCHitN)auVar105[0xb];
                  local_3e0[0xc] = (RTCHitN)auVar105[0xc];
                  local_3e0[0xd] = (RTCHitN)auVar105[0xd];
                  local_3e0[0xe] = (RTCHitN)auVar105[0xe];
                  local_3e0[0xf] = (RTCHitN)auVar105[0xf];
                  local_3e0[0x10] = (RTCHitN)auVar105[0x10];
                  local_3e0[0x11] = (RTCHitN)auVar105[0x11];
                  local_3e0[0x12] = (RTCHitN)auVar105[0x12];
                  local_3e0[0x13] = (RTCHitN)auVar105[0x13];
                  local_3e0[0x14] = (RTCHitN)auVar105[0x14];
                  local_3e0[0x15] = (RTCHitN)auVar105[0x15];
                  local_3e0[0x16] = (RTCHitN)auVar105[0x16];
                  local_3e0[0x17] = (RTCHitN)auVar105[0x17];
                  local_3e0[0x18] = (RTCHitN)auVar105[0x18];
                  local_3e0[0x19] = (RTCHitN)auVar105[0x19];
                  local_3e0[0x1a] = (RTCHitN)auVar105[0x1a];
                  local_3e0[0x1b] = (RTCHitN)auVar105[0x1b];
                  local_3e0[0x1c] = (RTCHitN)auVar105[0x1c];
                  local_3e0[0x1d] = (RTCHitN)auVar105[0x1d];
                  local_3e0[0x1e] = (RTCHitN)auVar105[0x1e];
                  local_3e0[0x1f] = (RTCHitN)auVar105[0x1f];
                  local_3a0 = uVar158;
                  uStack_39c = uVar158;
                  uStack_398 = uVar158;
                  uStack_394 = uVar158;
                  uStack_390 = uVar158;
                  uStack_38c = uVar158;
                  uStack_388 = uVar158;
                  uStack_384 = uVar158;
                  local_360 = ZEXT432(0) << 0x20;
                  local_340 = local_440._0_8_;
                  uStack_338 = local_440._8_8_;
                  uStack_330 = local_440._16_8_;
                  uStack_328 = local_440._24_8_;
                  local_320 = local_420;
                  auVar105 = vpcmpeqd_avx2(local_420,local_420);
                  local_860[1] = auVar105;
                  *local_860 = auVar105;
                  local_300 = pRVar14->instID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  local_2e0 = pRVar14->instPrimID[0];
                  uStack_2dc = local_2e0;
                  uStack_2d8 = local_2e0;
                  uStack_2d4 = local_2e0;
                  uStack_2d0 = local_2e0;
                  uStack_2cc = local_2e0;
                  uStack_2c8 = local_2e0;
                  uStack_2c4 = local_2e0;
                  *(float *)(ray + k * 4 + 0x100) = fVar172;
                  local_700 = local_480;
                  local_8d0.valid = (int *)local_700;
                  local_8d0.geometryUserPtr = pGVar8->userPtr;
                  local_8d0.context = context->user;
                  local_8d0.hit = local_3e0;
                  local_8d0.N = 8;
                  local_8d0.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar263 = ZEXT1664(auVar75);
                    (*pGVar8->intersectionFilterN)(&local_8d0);
                    auVar105 = vmovdqa64_avx512vl(auVar93);
                    auVar264 = ZEXT3264(auVar105);
                    auVar267 = ZEXT3264(local_8a0);
                  }
                  if (local_700 != (undefined1  [32])0x0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      (*p_Var13)(&local_8d0);
                      auVar105 = vmovdqa64_avx512vl(auVar93);
                      auVar264 = ZEXT3264(auVar105);
                      auVar267 = ZEXT3264(local_8a0);
                    }
                    if (local_700 != (undefined1  [32])0x0) {
                      uVar67 = vptestmd_avx512vl(local_700,local_700);
                      iVar3 = *(int *)(local_8d0.hit + 4);
                      iVar4 = *(int *)(local_8d0.hit + 8);
                      iVar1 = *(int *)(local_8d0.hit + 0xc);
                      iVar50 = *(int *)(local_8d0.hit + 0x10);
                      iVar51 = *(int *)(local_8d0.hit + 0x14);
                      iVar52 = *(int *)(local_8d0.hit + 0x18);
                      iVar53 = *(int *)(local_8d0.hit + 0x1c);
                      bVar59 = (byte)uVar67;
                      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar20 = SUB81(uVar67 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x180) =
                           (uint)(bVar59 & 1) * *(int *)local_8d0.hit |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_8d0.ray + 0x180);
                      *(uint *)(local_8d0.ray + 0x184) =
                           (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x184);
                      *(uint *)(local_8d0.ray + 0x188) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x188);
                      *(uint *)(local_8d0.ray + 0x18c) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x18c);
                      *(uint *)(local_8d0.ray + 400) =
                           (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 400);
                      *(uint *)(local_8d0.ray + 0x194) =
                           (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x194);
                      *(uint *)(local_8d0.ray + 0x198) =
                           (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x198);
                      *(uint *)(local_8d0.ray + 0x19c) =
                           (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x19c);
                      iVar3 = *(int *)(local_8d0.hit + 0x24);
                      iVar4 = *(int *)(local_8d0.hit + 0x28);
                      iVar1 = *(int *)(local_8d0.hit + 0x2c);
                      iVar50 = *(int *)(local_8d0.hit + 0x30);
                      iVar51 = *(int *)(local_8d0.hit + 0x34);
                      iVar52 = *(int *)(local_8d0.hit + 0x38);
                      iVar53 = *(int *)(local_8d0.hit + 0x3c);
                      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar20 = SUB81(uVar67 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1a0) =
                           (uint)(bVar59 & 1) * *(int *)(local_8d0.hit + 0x20) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                      *(uint *)(local_8d0.ray + 0x1a4) =
                           (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1a4);
                      *(uint *)(local_8d0.ray + 0x1a8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1a8);
                      *(uint *)(local_8d0.ray + 0x1ac) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1ac);
                      *(uint *)(local_8d0.ray + 0x1b0) =
                           (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1b0);
                      *(uint *)(local_8d0.ray + 0x1b4) =
                           (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1b4);
                      *(uint *)(local_8d0.ray + 0x1b8) =
                           (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1b8);
                      *(uint *)(local_8d0.ray + 0x1bc) =
                           (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1bc);
                      iVar3 = *(int *)(local_8d0.hit + 0x44);
                      iVar4 = *(int *)(local_8d0.hit + 0x48);
                      iVar1 = *(int *)(local_8d0.hit + 0x4c);
                      iVar50 = *(int *)(local_8d0.hit + 0x50);
                      iVar51 = *(int *)(local_8d0.hit + 0x54);
                      iVar52 = *(int *)(local_8d0.hit + 0x58);
                      iVar53 = *(int *)(local_8d0.hit + 0x5c);
                      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar20 = SUB81(uVar67 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1c0) =
                           (uint)(bVar59 & 1) * *(int *)(local_8d0.hit + 0x40) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                      *(uint *)(local_8d0.ray + 0x1c4) =
                           (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1c4);
                      *(uint *)(local_8d0.ray + 0x1c8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1c8);
                      *(uint *)(local_8d0.ray + 0x1cc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1cc);
                      *(uint *)(local_8d0.ray + 0x1d0) =
                           (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1d0);
                      *(uint *)(local_8d0.ray + 0x1d4) =
                           (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1d4);
                      *(uint *)(local_8d0.ray + 0x1d8) =
                           (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1d8);
                      *(uint *)(local_8d0.ray + 0x1dc) =
                           (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1dc);
                      iVar3 = *(int *)(local_8d0.hit + 100);
                      iVar4 = *(int *)(local_8d0.hit + 0x68);
                      iVar1 = *(int *)(local_8d0.hit + 0x6c);
                      iVar50 = *(int *)(local_8d0.hit + 0x70);
                      iVar51 = *(int *)(local_8d0.hit + 0x74);
                      iVar52 = *(int *)(local_8d0.hit + 0x78);
                      iVar53 = *(int *)(local_8d0.hit + 0x7c);
                      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar20 = SUB81(uVar67 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1e0) =
                           (uint)(bVar59 & 1) * *(int *)(local_8d0.hit + 0x60) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                      *(uint *)(local_8d0.ray + 0x1e4) =
                           (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1e4);
                      *(uint *)(local_8d0.ray + 0x1e8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1e8);
                      *(uint *)(local_8d0.ray + 0x1ec) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1ec);
                      *(uint *)(local_8d0.ray + 0x1f0) =
                           (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1f0);
                      *(uint *)(local_8d0.ray + 500) =
                           (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 500);
                      *(uint *)(local_8d0.ray + 0x1f8) =
                           (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1f8);
                      *(uint *)(local_8d0.ray + 0x1fc) =
                           (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1fc);
                      iVar3 = *(int *)(local_8d0.hit + 0x84);
                      iVar4 = *(int *)(local_8d0.hit + 0x88);
                      iVar1 = *(int *)(local_8d0.hit + 0x8c);
                      iVar50 = *(int *)(local_8d0.hit + 0x90);
                      iVar51 = *(int *)(local_8d0.hit + 0x94);
                      iVar52 = *(int *)(local_8d0.hit + 0x98);
                      iVar53 = *(int *)(local_8d0.hit + 0x9c);
                      bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                      bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                      bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                      bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                      bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                      bVar20 = SUB81(uVar67 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x200) =
                           (uint)(bVar59 & 1) * *(int *)(local_8d0.hit + 0x80) |
                           (uint)!(bool)(bVar59 & 1) * *(int *)(local_8d0.ray + 0x200);
                      *(uint *)(local_8d0.ray + 0x204) =
                           (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x204);
                      *(uint *)(local_8d0.ray + 0x208) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x208);
                      *(uint *)(local_8d0.ray + 0x20c) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x20c);
                      *(uint *)(local_8d0.ray + 0x210) =
                           (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x210);
                      *(uint *)(local_8d0.ray + 0x214) =
                           (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x214);
                      *(uint *)(local_8d0.ray + 0x218) =
                           (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x218);
                      *(uint *)(local_8d0.ray + 0x21c) =
                           (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x21c);
                      auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar105;
                      auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar105;
                      auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar105;
                      auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar105;
                      goto LAB_0190ef9c;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar173;
                }
              }
            }
          }
LAB_0190ef9c:
          uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar237._4_4_ = uVar158;
          auVar237._0_4_ = uVar158;
          auVar237._8_4_ = uVar158;
          auVar237._12_4_ = uVar158;
          auVar237._16_4_ = uVar158;
          auVar237._20_4_ = uVar158;
          auVar237._24_4_ = uVar158;
          auVar237._28_4_ = uVar158;
          auVar239 = ZEXT3264(auVar237);
          auVar54._4_4_ = fStack_4bc;
          auVar54._0_4_ = local_4c0;
          auVar54._8_4_ = fStack_4b8;
          auVar54._12_4_ = fStack_4b4;
          auVar54._16_4_ = fStack_4b0;
          auVar54._20_4_ = fStack_4ac;
          auVar54._24_4_ = fStack_4a8;
          auVar54._28_4_ = fStack_4a4;
          uVar25 = vcmpps_avx512vl(auVar237,auVar54,0xd);
          auVar265 = ZEXT3264(local_780);
          auVar266 = ZEXT3264(local_7a0);
        }
        auVar154._0_4_ = (float)local_500._0_4_ + (float)local_4e0._0_4_;
        auVar154._4_4_ = (float)local_500._4_4_ + (float)local_4e0._4_4_;
        auVar154._8_4_ = fStack_4f8 + fStack_4d8;
        auVar154._12_4_ = fStack_4f4 + fStack_4d4;
        auVar154._16_4_ = fStack_4f0 + fStack_4d0;
        auVar154._20_4_ = fStack_4ec + fStack_4cc;
        auVar154._24_4_ = fStack_4e8 + fStack_4c8;
        auVar154._28_4_ = fStack_4e4 + fStack_4c4;
        uVar158 = auVar239._0_4_;
        auVar170._4_4_ = uVar158;
        auVar170._0_4_ = uVar158;
        auVar170._8_4_ = uVar158;
        auVar170._12_4_ = uVar158;
        auVar170._16_4_ = uVar158;
        auVar170._20_4_ = uVar158;
        auVar170._24_4_ = uVar158;
        auVar170._28_4_ = uVar158;
        uVar25 = vcmpps_avx512vl(auVar154,auVar170,2);
        auVar155._8_4_ = 2;
        auVar155._0_8_ = 0x200000002;
        auVar155._12_4_ = 2;
        auVar155._16_4_ = 2;
        auVar155._20_4_ = 2;
        auVar155._24_4_ = 2;
        auVar155._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar105 = vpblendmd_avx512vl(auVar155,auVar40);
        local_4e0._0_4_ = (uint)(bVar57 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar66 = (bool)(bVar57 >> 1 & 1);
        local_4e0._4_4_ = (uint)bVar66 * auVar105._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar57 >> 2 & 1);
        fStack_4d8 = (float)((uint)bVar66 * auVar105._8_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 3 & 1);
        fStack_4d4 = (float)((uint)bVar66 * auVar105._12_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 4 & 1);
        fStack_4d0 = (float)((uint)bVar66 * auVar105._16_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 5 & 1);
        fStack_4cc = (float)((uint)bVar66 * auVar105._20_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)(bVar57 >> 6 & 1);
        fStack_4c8 = (float)((uint)bVar66 * auVar105._24_4_ | (uint)!bVar66 * 2);
        fStack_4c4 = (float)((uint)(bVar57 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2)
        ;
        bVar56 = (byte)uVar26 & bVar56 & (byte)uVar25;
        uVar25 = vpcmpd_avx512vl(_local_4e0,local_460,2);
        local_520 = _local_2c0;
        local_4c0 = (float)local_500._0_4_ + (float)local_2c0._0_4_;
        fStack_4bc = (float)local_500._4_4_ + (float)local_2c0._4_4_;
        fStack_4b8 = fStack_4f8 + fStack_2b8;
        fStack_4b4 = fStack_4f4 + fStack_2b4;
        fStack_4b0 = fStack_4f0 + fStack_2b0;
        fStack_4ac = fStack_4ec + fStack_2ac;
        fStack_4a8 = fStack_4e8 + fStack_2a8;
        fStack_4a4 = fStack_4e4 + fStack_2a4;
        auVar255 = ZEXT3264(local_840);
        auVar250 = ZEXT3264(local_7e0);
        auVar252 = ZEXT3264(local_800);
        auVar245 = ZEXT3264(local_820);
        for (bVar64 = (byte)uVar25 & bVar56; auVar228 = ZEXT3264(local_760), bVar64 != 0;
            bVar64 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar64 & (byte)uVar25) {
          auVar156._8_4_ = 0x7f800000;
          auVar156._0_8_ = 0x7f8000007f800000;
          auVar156._12_4_ = 0x7f800000;
          auVar156._16_4_ = 0x7f800000;
          auVar156._20_4_ = 0x7f800000;
          auVar156._24_4_ = 0x7f800000;
          auVar156._28_4_ = 0x7f800000;
          auVar105 = vblendmps_avx512vl(auVar156,local_520);
          auVar137._0_4_ =
               (uint)(bVar64 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 1 & 1);
          auVar137._4_4_ = (uint)bVar66 * auVar105._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 2 & 1);
          auVar137._8_4_ = (uint)bVar66 * auVar105._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 3 & 1);
          auVar137._12_4_ = (uint)bVar66 * auVar105._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 4 & 1);
          auVar137._16_4_ = (uint)bVar66 * auVar105._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 5 & 1);
          auVar137._20_4_ = (uint)bVar66 * auVar105._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar137._24_4_ =
               (uint)(bVar64 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
          auVar137._28_4_ = 0x7f800000;
          auVar105 = vshufps_avx(auVar137,auVar137,0xb1);
          auVar105 = vminps_avx(auVar137,auVar105);
          auVar103 = vshufpd_avx(auVar105,auVar105,5);
          auVar105 = vminps_avx(auVar105,auVar103);
          auVar103 = vpermpd_avx2(auVar105,0x4e);
          auVar105 = vminps_avx(auVar105,auVar103);
          uVar25 = vcmpps_avx512vl(auVar137,auVar105,0);
          bVar59 = (byte)uVar25 & bVar64;
          bVar57 = bVar64;
          if (bVar59 != 0) {
            bVar57 = bVar59;
          }
          iVar2 = 0;
          for (uVar68 = (uint)bVar57; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar68 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
          uVar138 = *(uint *)(local_2a0 + (uint)(iVar2 << 2));
          fVar157 = auVar83._0_4_;
          if ((float)local_7c0._0_4_ < 0.0) {
            auVar263 = ZEXT1664(auVar263._0_16_);
            fVar157 = sqrtf((float)local_7c0._0_4_);
            auVar105 = vmovdqa64_avx512vl(auVar93);
            auVar264 = ZEXT3264(auVar105);
            auVar245 = ZEXT3264(local_820);
            auVar267 = ZEXT3264(local_8a0);
            auVar252 = ZEXT3264(local_800);
            auVar250 = ZEXT3264(local_7e0);
            auVar255 = ZEXT3264(local_840);
          }
          auVar84 = vminps_avx(local_620._0_16_,local_660._0_16_);
          auVar88 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
          auVar89 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar90 = vminps_avx(auVar84,auVar89);
          auVar84 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar89 = vmaxps_avx(auVar88,auVar84);
          auVar209._8_4_ = 0x7fffffff;
          auVar209._0_8_ = 0x7fffffff7fffffff;
          auVar209._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar90,auVar209);
          auVar84 = vandps_avx(auVar89,auVar209);
          auVar88 = vmaxps_avx(auVar88,auVar84);
          auVar84 = vmovshdup_avx(auVar88);
          auVar84 = vmaxss_avx(auVar84,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar84);
          local_740._0_4_ = auVar88._0_4_ * 1.9073486e-06;
          local_600._0_4_ = fVar157 * 1.9073486e-06;
          local_6d0 = vshufps_avx(auVar89,auVar89,0xff);
          auVar88 = vinsertps_avx(ZEXT416(uVar138),ZEXT416(uVar68),0x10);
          auVar228 = ZEXT1664(auVar88);
          lVar61 = 5;
          do {
            do {
              bVar66 = lVar61 == 0;
              lVar61 = lVar61 + -1;
              if (bVar66) goto LAB_0190fc5c;
              fVar175 = auVar228._0_4_;
              auVar148._4_4_ = fVar175;
              auVar148._0_4_ = fVar175;
              auVar148._8_4_ = fVar175;
              auVar148._12_4_ = fVar175;
              auVar84 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_7b0);
              auVar79 = auVar228._0_16_;
              auVar88 = vmovshdup_avx(auVar79);
              local_580._0_16_ = auVar88;
              fVar176 = 1.0 - auVar88._0_4_;
              auVar88 = vshufps_avx(auVar79,auVar79,0x55);
              fVar157 = auVar88._0_4_;
              auVar189._0_4_ = local_660._0_4_ * fVar157;
              fVar172 = auVar88._4_4_;
              auVar189._4_4_ = local_660._4_4_ * fVar172;
              fVar173 = auVar88._8_4_;
              auVar189._8_4_ = local_660._8_4_ * fVar173;
              fVar174 = auVar88._12_4_;
              auVar189._12_4_ = local_660._12_4_ * fVar174;
              _local_560 = ZEXT416((uint)fVar176);
              auVar210._4_4_ = fVar176;
              auVar210._0_4_ = fVar176;
              auVar210._8_4_ = fVar176;
              auVar210._12_4_ = fVar176;
              auVar88 = vfmadd231ps_fma(auVar189,auVar210,local_620._0_16_);
              auVar223._0_4_ = local_640._0_4_ * fVar157;
              auVar223._4_4_ = local_640._4_4_ * fVar172;
              auVar223._8_4_ = local_640._8_4_ * fVar173;
              auVar223._12_4_ = local_640._12_4_ * fVar174;
              auVar89 = vfmadd231ps_fma(auVar223,auVar210,local_660._0_16_);
              auVar235._0_4_ = fVar157 * (float)local_680._0_4_;
              auVar235._4_4_ = fVar172 * (float)local_680._4_4_;
              auVar235._8_4_ = fVar173 * fStack_678;
              auVar235._12_4_ = fVar174 * fStack_674;
              auVar90 = vfmadd231ps_fma(auVar235,auVar210,local_640._0_16_);
              auVar243._0_4_ = fVar157 * auVar89._0_4_;
              auVar243._4_4_ = fVar172 * auVar89._4_4_;
              auVar243._8_4_ = fVar173 * auVar89._8_4_;
              auVar243._12_4_ = fVar174 * auVar89._12_4_;
              auVar88 = vfmadd231ps_fma(auVar243,auVar210,auVar88);
              auVar190._0_4_ = fVar157 * auVar90._0_4_;
              auVar190._4_4_ = fVar172 * auVar90._4_4_;
              auVar190._8_4_ = fVar173 * auVar90._8_4_;
              auVar190._12_4_ = fVar174 * auVar90._12_4_;
              auVar89 = vfmadd231ps_fma(auVar190,auVar210,auVar89);
              auVar224._0_4_ = fVar157 * auVar89._0_4_;
              auVar224._4_4_ = fVar172 * auVar89._4_4_;
              auVar224._8_4_ = fVar173 * auVar89._8_4_;
              auVar224._12_4_ = fVar174 * auVar89._12_4_;
              auVar90 = vfmadd231ps_fma(auVar224,auVar88,auVar210);
              auVar88 = vsubps_avx(auVar89,auVar88);
              auVar33._8_4_ = 0x40400000;
              auVar33._0_8_ = 0x4040000040400000;
              auVar33._12_4_ = 0x40400000;
              auVar89 = vmulps_avx512vl(auVar88,auVar33);
              local_540._0_16_ = auVar90;
              auVar84 = vsubps_avx(auVar84,auVar90);
              auVar88 = vdpps_avx(auVar84,auVar84,0x7f);
              fVar157 = auVar88._0_4_;
              if (fVar157 < 0.0) {
                auVar245._0_4_ = sqrtf(fVar157);
                auVar245._4_60_ = extraout_var_00;
                auVar90 = auVar245._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar88,auVar88);
              }
              local_5a0._0_16_ = vdpps_avx(auVar89,auVar89,0x7f);
              fVar172 = local_5a0._0_4_;
              auVar191._4_12_ = ZEXT812(0) << 0x20;
              auVar191._0_4_ = fVar172;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              local_5c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_5a0._0_16_,auVar34);
              auVar75 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
              local_5e0._0_4_ = auVar75._0_4_;
              local_720._0_4_ = auVar90._0_4_;
              if (fVar172 < auVar77._0_4_) {
                local_870 = auVar76;
                auVar250._0_4_ = sqrtf(fVar172);
                auVar250._4_60_ = extraout_var_01;
                auVar90 = ZEXT416((uint)local_720._0_4_);
                auVar77 = auVar250._0_16_;
                auVar75 = local_870;
              }
              else {
                auVar77 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                auVar75 = auVar76;
              }
              fVar173 = auVar75._0_4_;
              auVar80 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(auVar76._0_4_ * 1.5 +
                                                 fVar172 * -0.5 * fVar173 * fVar173 * fVar173)));
              auVar76 = vmulps_avx512vl(auVar89,auVar80);
              auVar75 = vdpps_avx(auVar84,auVar76,0x7f);
              fVar172 = auVar90._0_4_ + 1.0;
              auVar149._0_4_ = auVar75._0_4_ * auVar75._0_4_;
              auVar149._4_4_ = auVar75._4_4_ * auVar75._4_4_;
              auVar149._8_4_ = auVar75._8_4_ * auVar75._8_4_;
              auVar149._12_4_ = auVar75._12_4_ * auVar75._12_4_;
              auVar88 = vsubps_avx(auVar88,auVar149);
              fVar173 = auVar88._0_4_;
              auVar165._4_12_ = ZEXT812(0) << 0x20;
              auVar165._0_4_ = fVar173;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              auVar81 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              auVar82 = vmulss_avx512f(auVar88,ZEXT416(0xbf000000));
              if (fVar173 < 0.0) {
                local_870._0_4_ = fVar172;
                local_6a0._0_4_ = auVar81._0_4_;
                _local_6c0 = auVar80;
                local_6b0 = auVar76;
                local_690 = auVar78;
                fVar173 = sqrtf(fVar173);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar81 = ZEXT416((uint)local_6a0._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar90 = ZEXT416((uint)local_720._0_4_);
                auVar76 = local_6b0;
                fVar172 = (float)local_870._0_4_;
                auVar78 = local_690;
                auVar80 = _local_6c0;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar173 = auVar88._0_4_;
              }
              auVar255 = ZEXT3264(local_840);
              auVar267 = ZEXT3264(local_8a0);
              auVar105 = vmovdqa64_avx512vl(auVar93);
              auVar264 = ZEXT3264(auVar105);
              auVar24 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_560,local_580._0_16_);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_580._0_16_,_local_560);
              fVar174 = auVar88._0_4_ * 6.0;
              fVar176 = local_580._0_4_ * 6.0;
              auVar211._0_4_ = fVar176 * (float)local_680._0_4_;
              auVar211._4_4_ = fVar176 * (float)local_680._4_4_;
              auVar211._8_4_ = fVar176 * fStack_678;
              auVar211._12_4_ = fVar176 * fStack_674;
              auVar192._4_4_ = fVar174;
              auVar192._0_4_ = fVar174;
              auVar192._8_4_ = fVar174;
              auVar192._12_4_ = fVar174;
              auVar88 = vfmadd132ps_fma(auVar192,auVar211,local_640._0_16_);
              fVar174 = auVar24._0_4_ * 6.0;
              auVar166._4_4_ = fVar174;
              auVar166._0_4_ = fVar174;
              auVar166._8_4_ = fVar174;
              auVar166._12_4_ = fVar174;
              auVar88 = vfmadd132ps_fma(auVar166,auVar88,local_660._0_16_);
              fVar174 = local_560._0_4_ * 6.0;
              auVar193._4_4_ = fVar174;
              auVar193._0_4_ = fVar174;
              auVar193._8_4_ = fVar174;
              auVar193._12_4_ = fVar174;
              auVar88 = vfmadd132ps_fma(auVar193,auVar88,local_620._0_16_);
              auVar167._0_4_ = auVar88._0_4_ * (float)local_5a0._0_4_;
              auVar167._4_4_ = auVar88._4_4_ * (float)local_5a0._0_4_;
              auVar167._8_4_ = auVar88._8_4_ * (float)local_5a0._0_4_;
              auVar167._12_4_ = auVar88._12_4_ * (float)local_5a0._0_4_;
              auVar88 = vdpps_avx(auVar89,auVar88,0x7f);
              fVar174 = auVar88._0_4_;
              auVar194._0_4_ = auVar89._0_4_ * fVar174;
              auVar194._4_4_ = auVar89._4_4_ * fVar174;
              auVar194._8_4_ = auVar89._8_4_ * fVar174;
              auVar194._12_4_ = auVar89._12_4_ * fVar174;
              auVar88 = vsubps_avx(auVar167,auVar194);
              fVar174 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
              auVar24 = vmaxss_avx(ZEXT416((uint)local_740._0_4_),
                                   ZEXT416((uint)(fVar175 * (float)local_600._0_4_)));
              auVar195._0_4_ = auVar88._0_4_ * fVar174;
              auVar195._4_4_ = auVar88._4_4_ * fVar174;
              auVar195._8_4_ = auVar88._8_4_ * fVar174;
              auVar195._12_4_ = auVar88._12_4_ * fVar174;
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(auVar89,auVar35);
              auVar80 = vmulps_avx512vl(auVar80,auVar195);
              auVar88 = vdpps_avx(auVar91,auVar76,0x7f);
              auVar92 = vdivss_avx512f(ZEXT416((uint)local_740._0_4_),auVar77);
              auVar77 = vfmadd213ss_fma(auVar90,ZEXT416((uint)local_740._0_4_),auVar24);
              auVar90 = vdpps_avx(auVar84,auVar80,0x7f);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)fVar172),auVar92,auVar77);
              auVar263 = ZEXT1664(auVar80);
              fVar172 = auVar88._0_4_ + auVar90._0_4_;
              auVar88 = vdpps_avx(local_7b0,auVar76,0x7f);
              auVar90 = vdpps_avx(auVar84,auVar91,0x7f);
              auVar76 = vmulss_avx512f(auVar82,auVar78);
              auVar77 = vmulss_avx512f(auVar78,auVar78);
              auVar81 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar76._0_4_ * auVar77._0_4_)));
              auVar76 = vdpps_avx(auVar84,local_7b0,0x7f);
              auVar78 = vfnmadd231ss_fma(auVar90,auVar75,ZEXT416((uint)fVar172));
              auVar76 = vfnmadd231ss_fma(auVar76,auVar75,auVar88);
              auVar90 = vpermilps_avx(local_540._0_16_,0xff);
              fVar173 = fVar173 - auVar90._0_4_;
              auVar77 = vshufps_avx(auVar89,auVar89,0xff);
              auVar90 = vfmsub213ss_fma(auVar78,auVar81,auVar77);
              auVar248._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar248._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar248._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar76 = ZEXT416((uint)(auVar76._0_4_ * auVar81._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar90._0_4_)),
                                        ZEXT416((uint)fVar172),auVar76);
              auVar90 = vinsertps_avx(auVar248,auVar76,0x1c);
              auVar236._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar88._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar76 = vinsertps_avx(ZEXT416((uint)fVar172),auVar236,0x10);
              auVar212._0_4_ = auVar78._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar88 = vdivps_avx(auVar90,auVar212);
              auVar90 = vdivps_avx(auVar76,auVar212);
              auVar76 = vbroadcastss_avx512vl(auVar75);
              auVar213._0_4_ = auVar76._0_4_ * auVar88._0_4_ + fVar173 * auVar90._0_4_;
              auVar213._4_4_ = auVar76._4_4_ * auVar88._4_4_ + fVar173 * auVar90._4_4_;
              auVar213._8_4_ = auVar76._8_4_ * auVar88._8_4_ + fVar173 * auVar90._8_4_;
              auVar213._12_4_ = auVar76._12_4_ * auVar88._12_4_ + fVar173 * auVar90._12_4_;
              auVar88 = vsubps_avx(auVar79,auVar213);
              auVar228 = ZEXT1664(auVar88);
              auVar36._8_4_ = 0x7fffffff;
              auVar36._0_8_ = 0x7fffffff7fffffff;
              auVar36._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx512vl(auVar75,auVar36);
              auVar250 = ZEXT3264(local_7e0);
              auVar252 = ZEXT3264(local_800);
              auVar245 = ZEXT3264(local_820);
            } while (auVar80._0_4_ <= auVar90._0_4_);
            auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar24._0_4_)),local_6d0,
                                      ZEXT416(0x36000000));
            auVar37._8_4_ = 0x7fffffff;
            auVar37._0_8_ = 0x7fffffff7fffffff;
            auVar37._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(ZEXT416((uint)fVar173),auVar37);
          } while (auVar90._0_4_ <= auVar79._0_4_);
          fVar172 = auVar88._0_4_ + (float)local_6e0._0_4_;
          if (fVar22 <= fVar172) {
            fVar173 = *(float *)(ray + k * 4 + 0x100);
            auVar263 = ZEXT464((uint)fVar173);
            if (fVar172 <= fVar173) {
              auVar90 = vmovshdup_avx(auVar88);
              fVar174 = auVar90._0_4_;
              if ((0.0 <= fVar174) && (fVar174 <= 1.0)) {
                auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar157));
                fVar176 = auVar90._0_4_;
                pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar157 = fVar176 * 1.5 + fVar157 * -0.5 * fVar176 * fVar176 * fVar176;
                  auVar214._0_4_ = auVar84._0_4_ * fVar157;
                  auVar214._4_4_ = auVar84._4_4_ * fVar157;
                  auVar214._8_4_ = auVar84._8_4_ * fVar157;
                  auVar214._12_4_ = auVar84._12_4_ * fVar157;
                  auVar79 = vfmadd213ps_fma(auVar77,auVar214,auVar89);
                  auVar84 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar90 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar215._0_4_ = auVar214._0_4_ * auVar90._0_4_;
                  auVar215._4_4_ = auVar214._4_4_ * auVar90._4_4_;
                  auVar215._8_4_ = auVar214._8_4_ * auVar90._8_4_;
                  auVar215._12_4_ = auVar214._12_4_ * auVar90._12_4_;
                  auVar90 = vfmsub231ps_fma(auVar215,auVar89,auVar84);
                  auVar84 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar89 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                  auVar150._0_4_ = auVar79._0_4_ * auVar90._0_4_;
                  auVar150._4_4_ = auVar79._4_4_ * auVar90._4_4_;
                  auVar150._8_4_ = auVar79._8_4_ * auVar90._8_4_;
                  auVar150._12_4_ = auVar79._12_4_ * auVar90._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar150,auVar84,auVar89);
                  uVar158 = auVar84._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar172;
                    uVar7 = vextractps_avx(auVar84,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar7;
                    uVar7 = vextractps_avx(auVar84,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar158;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_848;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar14 = context->user;
                    auVar218._8_4_ = 1;
                    auVar218._0_8_ = 0x100000001;
                    auVar218._12_4_ = 1;
                    auVar218._16_4_ = 1;
                    auVar218._20_4_ = 1;
                    auVar218._24_4_ = 1;
                    auVar218._28_4_ = 1;
                    local_380 = vpermps_avx2(auVar218,ZEXT1632(auVar88));
                    auVar105 = vpermps_avx2(auVar218,ZEXT1632(auVar84));
                    auVar227._8_4_ = 2;
                    auVar227._0_8_ = 0x200000002;
                    auVar227._12_4_ = 2;
                    auVar227._16_4_ = 2;
                    auVar227._20_4_ = 2;
                    auVar227._24_4_ = 2;
                    auVar227._28_4_ = 2;
                    local_3c0 = vpermps_avx2(auVar227,ZEXT1632(auVar84));
                    local_3e0[0] = (RTCHitN)auVar105[0];
                    local_3e0[1] = (RTCHitN)auVar105[1];
                    local_3e0[2] = (RTCHitN)auVar105[2];
                    local_3e0[3] = (RTCHitN)auVar105[3];
                    local_3e0[4] = (RTCHitN)auVar105[4];
                    local_3e0[5] = (RTCHitN)auVar105[5];
                    local_3e0[6] = (RTCHitN)auVar105[6];
                    local_3e0[7] = (RTCHitN)auVar105[7];
                    local_3e0[8] = (RTCHitN)auVar105[8];
                    local_3e0[9] = (RTCHitN)auVar105[9];
                    local_3e0[10] = (RTCHitN)auVar105[10];
                    local_3e0[0xb] = (RTCHitN)auVar105[0xb];
                    local_3e0[0xc] = (RTCHitN)auVar105[0xc];
                    local_3e0[0xd] = (RTCHitN)auVar105[0xd];
                    local_3e0[0xe] = (RTCHitN)auVar105[0xe];
                    local_3e0[0xf] = (RTCHitN)auVar105[0xf];
                    local_3e0[0x10] = (RTCHitN)auVar105[0x10];
                    local_3e0[0x11] = (RTCHitN)auVar105[0x11];
                    local_3e0[0x12] = (RTCHitN)auVar105[0x12];
                    local_3e0[0x13] = (RTCHitN)auVar105[0x13];
                    local_3e0[0x14] = (RTCHitN)auVar105[0x14];
                    local_3e0[0x15] = (RTCHitN)auVar105[0x15];
                    local_3e0[0x16] = (RTCHitN)auVar105[0x16];
                    local_3e0[0x17] = (RTCHitN)auVar105[0x17];
                    local_3e0[0x18] = (RTCHitN)auVar105[0x18];
                    local_3e0[0x19] = (RTCHitN)auVar105[0x19];
                    local_3e0[0x1a] = (RTCHitN)auVar105[0x1a];
                    local_3e0[0x1b] = (RTCHitN)auVar105[0x1b];
                    local_3e0[0x1c] = (RTCHitN)auVar105[0x1c];
                    local_3e0[0x1d] = (RTCHitN)auVar105[0x1d];
                    local_3e0[0x1e] = (RTCHitN)auVar105[0x1e];
                    local_3e0[0x1f] = (RTCHitN)auVar105[0x1f];
                    local_3a0 = uVar158;
                    uStack_39c = uVar158;
                    uStack_398 = uVar158;
                    uStack_394 = uVar158;
                    uStack_390 = uVar158;
                    uStack_38c = uVar158;
                    uStack_388 = uVar158;
                    uStack_384 = uVar158;
                    local_360 = ZEXT432(0) << 0x20;
                    local_340 = local_440._0_8_;
                    uStack_338 = local_440._8_8_;
                    uStack_330 = local_440._16_8_;
                    uStack_328 = local_440._24_8_;
                    local_320 = local_420;
                    auVar105 = vpcmpeqd_avx2(local_420,local_420);
                    local_860[1] = auVar105;
                    *local_860 = auVar105;
                    local_300 = pRVar14->instID[0];
                    uStack_2fc = local_300;
                    uStack_2f8 = local_300;
                    uStack_2f4 = local_300;
                    uStack_2f0 = local_300;
                    uStack_2ec = local_300;
                    uStack_2e8 = local_300;
                    uStack_2e4 = local_300;
                    local_2e0 = pRVar14->instPrimID[0];
                    uStack_2dc = local_2e0;
                    uStack_2d8 = local_2e0;
                    uStack_2d4 = local_2e0;
                    uStack_2d0 = local_2e0;
                    uStack_2cc = local_2e0;
                    uStack_2c8 = local_2e0;
                    uStack_2c4 = local_2e0;
                    *(float *)(ray + k * 4 + 0x100) = fVar172;
                    local_700 = local_480;
                    local_8d0.valid = (int *)local_700;
                    local_8d0.geometryUserPtr = pGVar8->userPtr;
                    local_8d0.context = context->user;
                    local_8d0.hit = local_3e0;
                    local_8d0.N = 8;
                    local_8d0.ray = (RTCRayN *)ray;
                    if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar8->intersectionFilterN)(&local_8d0);
                      auVar105 = vmovdqa64_avx512vl(auVar93);
                      auVar264 = ZEXT3264(auVar105);
                      auVar245 = ZEXT3264(local_820);
                      auVar267 = ZEXT3264(local_8a0);
                      auVar252 = ZEXT3264(local_800);
                      auVar250 = ZEXT3264(local_7e0);
                      auVar255 = ZEXT3264(local_840);
                    }
                    if (local_700 != (undefined1  [32])0x0) {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_8d0);
                        auVar105 = vmovdqa64_avx512vl(auVar93);
                        auVar264 = ZEXT3264(auVar105);
                        auVar245 = ZEXT3264(local_820);
                        auVar267 = ZEXT3264(local_8a0);
                        auVar252 = ZEXT3264(local_800);
                        auVar250 = ZEXT3264(local_7e0);
                        auVar255 = ZEXT3264(local_840);
                      }
                      auVar263 = ZEXT464((uint)fVar173);
                      if (local_700 != (undefined1  [32])0x0) {
                        uVar67 = vptestmd_avx512vl(local_700,local_700);
                        iVar3 = *(int *)(local_8d0.hit + 4);
                        iVar4 = *(int *)(local_8d0.hit + 8);
                        iVar1 = *(int *)(local_8d0.hit + 0xc);
                        iVar50 = *(int *)(local_8d0.hit + 0x10);
                        iVar51 = *(int *)(local_8d0.hit + 0x14);
                        iVar52 = *(int *)(local_8d0.hit + 0x18);
                        iVar53 = *(int *)(local_8d0.hit + 0x1c);
                        bVar57 = (byte)uVar67;
                        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar20 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x180) =
                             (uint)(bVar57 & 1) * *(int *)local_8d0.hit |
                             (uint)!(bool)(bVar57 & 1) * *(int *)(local_8d0.ray + 0x180);
                        *(uint *)(local_8d0.ray + 0x184) =
                             (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x184);
                        *(uint *)(local_8d0.ray + 0x188) =
                             (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x188);
                        *(uint *)(local_8d0.ray + 0x18c) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x18c);
                        *(uint *)(local_8d0.ray + 400) =
                             (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 400);
                        *(uint *)(local_8d0.ray + 0x194) =
                             (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x194)
                        ;
                        *(uint *)(local_8d0.ray + 0x198) =
                             (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x198)
                        ;
                        *(uint *)(local_8d0.ray + 0x19c) =
                             (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x19c)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x24);
                        iVar4 = *(int *)(local_8d0.hit + 0x28);
                        iVar1 = *(int *)(local_8d0.hit + 0x2c);
                        iVar50 = *(int *)(local_8d0.hit + 0x30);
                        iVar51 = *(int *)(local_8d0.hit + 0x34);
                        iVar52 = *(int *)(local_8d0.hit + 0x38);
                        iVar53 = *(int *)(local_8d0.hit + 0x3c);
                        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar20 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1a0) =
                             (uint)(bVar57 & 1) * *(int *)(local_8d0.hit + 0x20) |
                             (uint)!(bool)(bVar57 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                        *(uint *)(local_8d0.ray + 0x1a4) =
                             (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1a4);
                        *(uint *)(local_8d0.ray + 0x1a8) =
                             (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1a8);
                        *(uint *)(local_8d0.ray + 0x1ac) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1ac);
                        *(uint *)(local_8d0.ray + 0x1b0) =
                             (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1b0)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b4) =
                             (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b8) =
                             (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1bc) =
                             (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1bc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x44);
                        iVar4 = *(int *)(local_8d0.hit + 0x48);
                        iVar1 = *(int *)(local_8d0.hit + 0x4c);
                        iVar50 = *(int *)(local_8d0.hit + 0x50);
                        iVar51 = *(int *)(local_8d0.hit + 0x54);
                        iVar52 = *(int *)(local_8d0.hit + 0x58);
                        iVar53 = *(int *)(local_8d0.hit + 0x5c);
                        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar20 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1c0) =
                             (uint)(bVar57 & 1) * *(int *)(local_8d0.hit + 0x40) |
                             (uint)!(bool)(bVar57 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                        *(uint *)(local_8d0.ray + 0x1c4) =
                             (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1c4);
                        *(uint *)(local_8d0.ray + 0x1c8) =
                             (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1c8);
                        *(uint *)(local_8d0.ray + 0x1cc) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1cc);
                        *(uint *)(local_8d0.ray + 0x1d0) =
                             (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1d0)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d4) =
                             (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d8) =
                             (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1dc) =
                             (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1dc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 100);
                        iVar4 = *(int *)(local_8d0.hit + 0x68);
                        iVar1 = *(int *)(local_8d0.hit + 0x6c);
                        iVar50 = *(int *)(local_8d0.hit + 0x70);
                        iVar51 = *(int *)(local_8d0.hit + 0x74);
                        iVar52 = *(int *)(local_8d0.hit + 0x78);
                        iVar53 = *(int *)(local_8d0.hit + 0x7c);
                        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar20 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1e0) =
                             (uint)(bVar57 & 1) * *(int *)(local_8d0.hit + 0x60) |
                             (uint)!(bool)(bVar57 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                        *(uint *)(local_8d0.ray + 0x1e4) =
                             (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x1e4);
                        *(uint *)(local_8d0.ray + 0x1e8) =
                             (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1e8);
                        *(uint *)(local_8d0.ray + 0x1ec) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x1ec);
                        *(uint *)(local_8d0.ray + 0x1f0) =
                             (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x1f0)
                        ;
                        *(uint *)(local_8d0.ray + 500) =
                             (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 500);
                        *(uint *)(local_8d0.ray + 0x1f8) =
                             (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1fc) =
                             (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x1fc)
                        ;
                        iVar3 = *(int *)(local_8d0.hit + 0x84);
                        iVar4 = *(int *)(local_8d0.hit + 0x88);
                        iVar1 = *(int *)(local_8d0.hit + 0x8c);
                        iVar50 = *(int *)(local_8d0.hit + 0x90);
                        iVar51 = *(int *)(local_8d0.hit + 0x94);
                        iVar52 = *(int *)(local_8d0.hit + 0x98);
                        iVar53 = *(int *)(local_8d0.hit + 0x9c);
                        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar20 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x200) =
                             (uint)(bVar57 & 1) * *(int *)(local_8d0.hit + 0x80) |
                             (uint)!(bool)(bVar57 & 1) * *(int *)(local_8d0.ray + 0x200);
                        *(uint *)(local_8d0.ray + 0x204) =
                             (uint)bVar66 * iVar3 | (uint)!bVar66 * *(int *)(local_8d0.ray + 0x204);
                        *(uint *)(local_8d0.ray + 0x208) =
                             (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x208);
                        *(uint *)(local_8d0.ray + 0x20c) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_8d0.ray + 0x20c);
                        *(uint *)(local_8d0.ray + 0x210) =
                             (uint)bVar17 * iVar50 | (uint)!bVar17 * *(int *)(local_8d0.ray + 0x210)
                        ;
                        *(uint *)(local_8d0.ray + 0x214) =
                             (uint)bVar18 * iVar51 | (uint)!bVar18 * *(int *)(local_8d0.ray + 0x214)
                        ;
                        *(uint *)(local_8d0.ray + 0x218) =
                             (uint)bVar19 * iVar52 | (uint)!bVar19 * *(int *)(local_8d0.ray + 0x218)
                        ;
                        *(uint *)(local_8d0.ray + 0x21c) =
                             (uint)bVar20 * iVar53 | (uint)!bVar20 * *(int *)(local_8d0.ray + 0x21c)
                        ;
                        auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar105;
                        auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar105;
                        auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar105;
                        auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar105;
                        goto LAB_0190fc5c;
                      }
                    }
                    auVar263 = ZEXT464((uint)fVar173);
                    *(float *)(ray + k * 4 + 0x100) = fVar173;
                  }
                }
              }
            }
          }
LAB_0190fc5c:
          uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar238._4_4_ = uVar158;
          auVar238._0_4_ = uVar158;
          auVar238._8_4_ = uVar158;
          auVar238._12_4_ = uVar158;
          auVar238._16_4_ = uVar158;
          auVar238._20_4_ = uVar158;
          auVar238._24_4_ = uVar158;
          auVar238._28_4_ = uVar158;
          auVar239 = ZEXT3264(auVar238);
          auVar55._4_4_ = fStack_4bc;
          auVar55._0_4_ = local_4c0;
          auVar55._8_4_ = fStack_4b8;
          auVar55._12_4_ = fStack_4b4;
          auVar55._16_4_ = fStack_4b0;
          auVar55._20_4_ = fStack_4ac;
          auVar55._24_4_ = fStack_4a8;
          auVar55._28_4_ = fStack_4a4;
          uVar25 = vcmpps_avx512vl(auVar238,auVar55,0xd);
          auVar265 = ZEXT3264(local_780);
          auVar266 = ZEXT3264(local_7a0);
        }
        uVar27 = vpcmpd_avx512vl(local_460,local_280,1);
        uVar26 = vpcmpd_avx512vl(local_460,_local_4e0,1);
        auVar171._0_4_ = (float)local_500._0_4_ + (float)local_200._0_4_;
        auVar171._4_4_ = (float)local_500._4_4_ + (float)local_200._4_4_;
        auVar171._8_4_ = fStack_4f8 + fStack_1f8;
        auVar171._12_4_ = fStack_4f4 + fStack_1f4;
        auVar171._16_4_ = fStack_4f0 + fStack_1f0;
        auVar171._20_4_ = fStack_4ec + fStack_1ec;
        auVar171._24_4_ = fStack_4e8 + fStack_1e8;
        auVar171._28_4_ = fStack_4e4 + fStack_1e4;
        uVar158 = auVar239._0_4_;
        auVar200._4_4_ = uVar158;
        auVar200._0_4_ = uVar158;
        auVar200._8_4_ = uVar158;
        auVar200._12_4_ = uVar158;
        auVar200._16_4_ = uVar158;
        auVar200._20_4_ = uVar158;
        auVar200._24_4_ = uVar158;
        auVar200._28_4_ = uVar158;
        uVar25 = vcmpps_avx512vl(auVar171,auVar200,2);
        bVar62 = bVar62 & (byte)uVar27 & (byte)uVar25;
        auVar219._0_4_ = (float)local_500._0_4_ + (float)local_2c0._0_4_;
        auVar219._4_4_ = (float)local_500._4_4_ + (float)local_2c0._4_4_;
        auVar219._8_4_ = fStack_4f8 + fStack_2b8;
        auVar219._12_4_ = fStack_4f4 + fStack_2b4;
        auVar219._16_4_ = fStack_4f0 + fStack_2b0;
        auVar219._20_4_ = fStack_4ec + fStack_2ac;
        auVar219._24_4_ = fStack_4e8 + fStack_2a8;
        auVar219._28_4_ = fStack_4e4 + fStack_2a4;
        uVar25 = vcmpps_avx512vl(auVar219,auVar200,2);
        bVar56 = bVar56 & (byte)uVar26 & (byte)uVar25 | bVar62;
        if (bVar56 != 0) {
          uVar60 = (ulong)uVar65;
          abStack_180[uVar60 * 0x60] = bVar56;
          bVar66 = (bool)(bVar62 >> 1 & 1);
          bVar15 = (bool)(bVar62 >> 2 & 1);
          bVar16 = (bool)(bVar62 >> 3 & 1);
          bVar17 = (bool)(bVar62 >> 4 & 1);
          bVar18 = (bool)(bVar62 >> 5 & 1);
          auStack_160[uVar60 * 0x18] =
               (uint)(bVar62 & 1) * local_200._0_4_ | (uint)!(bool)(bVar62 & 1) * local_2c0._0_4_;
          auStack_160[uVar60 * 0x18 + 1] =
               (uint)bVar66 * local_200._4_4_ | (uint)!bVar66 * local_2c0._4_4_;
          auStack_160[uVar60 * 0x18 + 2] =
               (uint)bVar15 * (int)fStack_1f8 | (uint)!bVar15 * (int)fStack_2b8;
          auStack_160[uVar60 * 0x18 + 3] =
               (uint)bVar16 * (int)fStack_1f4 | (uint)!bVar16 * (int)fStack_2b4;
          auStack_160[uVar60 * 0x18 + 4] =
               (uint)bVar17 * (int)fStack_1f0 | (uint)!bVar17 * (int)fStack_2b0;
          auStack_160[uVar60 * 0x18 + 5] =
               (uint)bVar18 * (int)fStack_1ec | (uint)!bVar18 * (int)fStack_2ac;
          auStack_160[uVar60 * 0x18 + 6] =
               (uint)(bVar62 >> 6) * (int)fStack_1e8 | (uint)!(bool)(bVar62 >> 6) * (int)fStack_2a8;
          (&fStack_144)[uVar60 * 0x18] = fStack_2a4;
          uVar67 = vmovlps_avx(local_490);
          (&uStack_140)[uVar60 * 0xc] = uVar67;
          aiStack_138[uVar60 * 0x18] = local_af4 + 1;
          uVar65 = uVar65 + 1;
        }
        auVar239 = ZEXT3264(_DAT_01f7b040);
        prim = local_858;
      }
    }
    do {
      uVar138 = uVar65;
      uVar68 = uVar138 - 1;
      if (uVar138 == 0) {
        uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar38._4_4_ = uVar158;
        auVar38._0_4_ = uVar158;
        auVar38._8_4_ = uVar158;
        auVar38._12_4_ = uVar158;
        uVar25 = vcmpps_avx512vl(local_4a0,auVar38,2);
        local_850 = (ulong)((uint)uVar25 & (uint)local_850 - 1 & (uint)local_850);
        goto LAB_0190d665;
      }
      uVar67 = (ulong)uVar68;
      auVar105 = *(undefined1 (*) [32])(auStack_160 + uVar67 * 0x18);
      auVar168._0_4_ = auVar105._0_4_ + (float)local_500._0_4_;
      auVar168._4_4_ = auVar105._4_4_ + (float)local_500._4_4_;
      auVar168._8_4_ = auVar105._8_4_ + fStack_4f8;
      auVar168._12_4_ = auVar105._12_4_ + fStack_4f4;
      auVar168._16_4_ = auVar105._16_4_ + fStack_4f0;
      auVar168._20_4_ = auVar105._20_4_ + fStack_4ec;
      auVar168._24_4_ = auVar105._24_4_ + fStack_4e8;
      auVar168._28_4_ = auVar105._28_4_ + fStack_4e4;
      uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar41._4_4_ = uVar158;
      auVar41._0_4_ = uVar158;
      auVar41._8_4_ = uVar158;
      auVar41._12_4_ = uVar158;
      auVar41._16_4_ = uVar158;
      auVar41._20_4_ = uVar158;
      auVar41._24_4_ = uVar158;
      auVar41._28_4_ = uVar158;
      uVar25 = vcmpps_avx512vl(auVar168,auVar41,2);
      uVar139 = (uint)uVar25 & (uint)abStack_180[uVar67 * 0x60];
      uVar65 = uVar68;
    } while (uVar139 == 0);
    uVar60 = (&uStack_140)[uVar67 * 0xc];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar60;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar103 = vblendmps_avx512vl(auVar199,auVar105);
    bVar56 = (byte)uVar139;
    auVar135._0_4_ =
         (uint)(bVar56 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar105._0_4_;
    bVar66 = (bool)((byte)(uVar139 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar66 * auVar103._4_4_ | (uint)!bVar66 * (int)auVar105._4_4_;
    bVar66 = (bool)((byte)(uVar139 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar66 * auVar103._8_4_ | (uint)!bVar66 * (int)auVar105._8_4_;
    bVar66 = (bool)((byte)(uVar139 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar66 * auVar103._12_4_ | (uint)!bVar66 * (int)auVar105._12_4_;
    bVar66 = (bool)((byte)(uVar139 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar66 * auVar103._16_4_ | (uint)!bVar66 * (int)auVar105._16_4_;
    bVar66 = (bool)((byte)(uVar139 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar66 * auVar103._20_4_ | (uint)!bVar66 * (int)auVar105._20_4_;
    bVar66 = (bool)((byte)(uVar139 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar66 * auVar103._24_4_ | (uint)!bVar66 * (int)auVar105._24_4_;
    auVar135._28_4_ =
         (uVar139 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar139 >> 7,0) * (int)auVar105._28_4_;
    auVar105 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar105 = vminps_avx(auVar135,auVar105);
    auVar103 = vshufpd_avx(auVar105,auVar105,5);
    auVar105 = vminps_avx(auVar105,auVar103);
    auVar103 = vpermpd_avx2(auVar105,0x4e);
    auVar105 = vminps_avx(auVar105,auVar103);
    uVar25 = vcmpps_avx512vl(auVar135,auVar105,0);
    bVar64 = (byte)uVar25 & bVar56;
    if (bVar64 != 0) {
      uVar139 = (uint)bVar64;
    }
    uVar140 = 0;
    for (; (uVar139 & 1) == 0; uVar139 = uVar139 >> 1 | 0x80000000) {
      uVar140 = uVar140 + 1;
    }
    local_af4 = aiStack_138[uVar67 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar140 & 0x1f)) & bVar56;
    abStack_180[uVar67 * 0x60] = bVar56;
    uVar65 = uVar138;
    if (bVar56 == 0) {
      uVar65 = uVar68;
    }
    uVar158 = (undefined4)uVar60;
    auVar151._4_4_ = uVar158;
    auVar151._0_4_ = uVar158;
    auVar151._8_4_ = uVar158;
    auVar151._12_4_ = uVar158;
    auVar151._16_4_ = uVar158;
    auVar151._20_4_ = uVar158;
    auVar151._24_4_ = uVar158;
    auVar151._28_4_ = uVar158;
    auVar88 = vmovshdup_avx(auVar161);
    auVar88 = vsubps_avx(auVar88,auVar161);
    auVar169._0_4_ = auVar88._0_4_;
    auVar169._4_4_ = auVar169._0_4_;
    auVar169._8_4_ = auVar169._0_4_;
    auVar169._12_4_ = auVar169._0_4_;
    auVar169._16_4_ = auVar169._0_4_;
    auVar169._20_4_ = auVar169._0_4_;
    auVar169._24_4_ = auVar169._0_4_;
    auVar169._28_4_ = auVar169._0_4_;
    auVar88 = vfmadd132ps_fma(auVar169,auVar151,auVar239._0_32_);
    auVar105 = ZEXT1632(auVar88);
    local_3e0[0] = (RTCHitN)auVar105[0];
    local_3e0[1] = (RTCHitN)auVar105[1];
    local_3e0[2] = (RTCHitN)auVar105[2];
    local_3e0[3] = (RTCHitN)auVar105[3];
    local_3e0[4] = (RTCHitN)auVar105[4];
    local_3e0[5] = (RTCHitN)auVar105[5];
    local_3e0[6] = (RTCHitN)auVar105[6];
    local_3e0[7] = (RTCHitN)auVar105[7];
    local_3e0[8] = (RTCHitN)auVar105[8];
    local_3e0[9] = (RTCHitN)auVar105[9];
    local_3e0[10] = (RTCHitN)auVar105[10];
    local_3e0[0xb] = (RTCHitN)auVar105[0xb];
    local_3e0[0xc] = (RTCHitN)auVar105[0xc];
    local_3e0[0xd] = (RTCHitN)auVar105[0xd];
    local_3e0[0xe] = (RTCHitN)auVar105[0xe];
    local_3e0[0xf] = (RTCHitN)auVar105[0xf];
    local_3e0[0x10] = (RTCHitN)auVar105[0x10];
    local_3e0[0x11] = (RTCHitN)auVar105[0x11];
    local_3e0[0x12] = (RTCHitN)auVar105[0x12];
    local_3e0[0x13] = (RTCHitN)auVar105[0x13];
    local_3e0[0x14] = (RTCHitN)auVar105[0x14];
    local_3e0[0x15] = (RTCHitN)auVar105[0x15];
    local_3e0[0x16] = (RTCHitN)auVar105[0x16];
    local_3e0[0x17] = (RTCHitN)auVar105[0x17];
    local_3e0[0x18] = (RTCHitN)auVar105[0x18];
    local_3e0[0x19] = (RTCHitN)auVar105[0x19];
    local_3e0[0x1a] = (RTCHitN)auVar105[0x1a];
    local_3e0[0x1b] = (RTCHitN)auVar105[0x1b];
    local_3e0[0x1c] = (RTCHitN)auVar105[0x1c];
    local_3e0[0x1d] = (RTCHitN)auVar105[0x1d];
    local_3e0[0x1e] = (RTCHitN)auVar105[0x1e];
    local_3e0[0x1f] = (RTCHitN)auVar105[0x1f];
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar140 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }